

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O1

void VP8YuvToBgr32_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  byte bVar1;
  byte bVar9;
  byte bVar17;
  byte bVar25;
  byte bVar33;
  byte bVar41;
  byte bVar49;
  byte bVar57;
  byte bVar65;
  byte bVar73;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  short sVar121;
  short sVar122;
  short sVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [12];
  undefined1 auVar153 [12];
  undefined1 auVar154 [12];
  undefined1 auVar155 [12];
  undefined1 auVar156 [12];
  undefined1 auVar157 [12];
  undefined1 auVar158 [12];
  undefined1 auVar159 [12];
  undefined1 auVar160 [12];
  undefined1 auVar161 [12];
  undefined1 auVar162 [12];
  undefined1 auVar163 [12];
  undefined1 auVar164 [12];
  undefined1 auVar165 [12];
  undefined1 auVar166 [12];
  undefined1 auVar167 [12];
  undefined1 auVar168 [12];
  undefined1 auVar169 [12];
  undefined1 auVar170 [12];
  undefined1 auVar171 [12];
  undefined1 auVar172 [12];
  undefined1 auVar173 [12];
  undefined1 auVar174 [12];
  undefined1 auVar175 [12];
  undefined1 auVar176 [12];
  undefined1 auVar177 [12];
  undefined1 auVar178 [12];
  undefined1 auVar179 [12];
  undefined1 auVar180 [12];
  undefined1 auVar181 [12];
  undefined1 auVar182 [12];
  undefined1 auVar183 [12];
  undefined1 auVar184 [12];
  undefined1 auVar185 [12];
  undefined1 auVar186 [12];
  undefined1 auVar187 [12];
  undefined4 uVar188;
  undefined8 uVar191;
  undefined1 auVar194 [12];
  undefined1 auVar195 [12];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  ushort uVar206;
  ushort uVar223;
  undefined4 uVar207;
  ushort uVar227;
  undefined1 auVar211 [12];
  undefined1 auVar212 [12];
  undefined1 auVar213 [12];
  ushort uVar224;
  ushort uVar225;
  ushort uVar226;
  ushort uVar228;
  undefined1 auVar218 [16];
  ushort uVar229;
  ushort uVar230;
  undefined4 uVar231;
  ushort uVar239;
  ushort uVar240;
  ushort uVar241;
  ushort uVar242;
  undefined1 auVar234 [12];
  ushort uVar243;
  ushort uVar244;
  ushort uVar245;
  undefined1 auVar246 [16];
  undefined4 uVar247;
  undefined8 uVar249;
  undefined1 auVar252 [12];
  ushort uVar259;
  undefined4 uVar260;
  ushort uVar272;
  ushort uVar273;
  ushort uVar274;
  ushort uVar275;
  undefined1 auVar264 [12];
  undefined1 auVar265 [12];
  ushort uVar276;
  ushort uVar277;
  ushort uVar278;
  ushort uVar279;
  undefined4 uVar280;
  ushort uVar292;
  ushort uVar293;
  undefined8 uVar282;
  ushort uVar294;
  ushort uVar295;
  undefined1 auVar285 [12];
  ushort uVar296;
  ushort uVar297;
  ushort uVar298;
  undefined4 uVar299;
  undefined1 auVar303 [12];
  undefined1 auVar306 [16];
  undefined4 uVar309;
  undefined8 uVar311;
  ushort uVar318;
  undefined4 uVar319;
  ushort uVar328;
  ushort uVar329;
  ushort uVar330;
  ushort uVar331;
  undefined1 auVar323 [12];
  ushort uVar332;
  ushort uVar333;
  ushort uVar334;
  undefined1 auVar335 [12];
  undefined1 auVar336 [12];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  ushort uVar343;
  undefined1 auVar344 [12];
  ushort uVar348;
  ushort uVar349;
  ushort uVar350;
  ushort uVar351;
  ushort uVar352;
  ushort uVar353;
  ushort uVar354;
  undefined1 auVar346 [16];
  undefined1 auVar355 [12];
  undefined1 auVar357 [16];
  undefined1 auVar359 [12];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar74;
  char cVar75;
  undefined6 uVar189;
  undefined8 uVar190;
  undefined1 auVar192 [12];
  undefined1 auVar193 [12];
  undefined1 auVar196 [14];
  undefined1 auVar197 [14];
  undefined1 auVar198 [14];
  undefined1 auVar199 [14];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined6 uVar208;
  undefined8 uVar209;
  undefined1 auVar210 [12];
  undefined1 auVar214 [14];
  undefined1 auVar215 [14];
  undefined1 auVar216 [14];
  undefined1 auVar217 [14];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined6 uVar232;
  undefined1 auVar233 [12];
  undefined1 auVar235 [14];
  undefined1 auVar236 [14];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined6 uVar248;
  undefined1 auVar250 [12];
  undefined1 auVar251 [12];
  undefined1 auVar253 [14];
  undefined1 auVar254 [14];
  undefined1 auVar255 [14];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined6 uVar261;
  undefined8 uVar262;
  undefined1 auVar263 [12];
  undefined1 auVar266 [14];
  undefined1 auVar267 [14];
  undefined1 auVar268 [14];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined6 uVar281;
  undefined1 auVar283 [12];
  undefined1 auVar284 [12];
  undefined1 auVar286 [14];
  undefined1 auVar287 [14];
  undefined1 auVar288 [14];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined6 uVar300;
  undefined8 uVar301;
  undefined1 auVar302 [12];
  undefined1 auVar304 [14];
  undefined1 auVar305 [14];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined6 uVar310;
  undefined1 auVar312 [12];
  undefined1 auVar313 [12];
  undefined1 auVar314 [14];
  undefined1 auVar315 [14];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined6 uVar320;
  undefined8 uVar321;
  undefined1 auVar322 [12];
  undefined1 auVar324 [14];
  undefined1 auVar325 [14];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar337 [14];
  undefined1 auVar338 [14];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar345 [14];
  undefined1 auVar347 [16];
  undefined1 auVar356 [14];
  undefined1 auVar358 [16];
  undefined1 auVar360 [14];
  undefined1 auVar363 [16];
  
  uVar191 = *(undefined8 *)y;
  auVar152[10] = 0;
  auVar152._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar152[0xb] = (char)((ulong)uVar191 >> 0x28);
  auVar164[9] = (char)((ulong)uVar191 >> 0x20);
  auVar164._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar164._10_2_ = auVar152._10_2_;
  auVar176._9_3_ = auVar164._9_3_;
  auVar176._0_9_ = (unkuint9)0;
  auVar129._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar176._8_4_,(char)((ulong)uVar191 >> 0x18))) << 0x38,6);
  auVar129[0] = (char)((ulong)uVar191 >> 0x10);
  auVar129._11_5_ = 0;
  auVar128._1_12_ = SUB1612(auVar129 << 0x28,4);
  auVar128[0] = (char)((ulong)uVar191 >> 8);
  auVar128._13_3_ = 0;
  auVar200._1_14_ = SUB1614(auVar128 << 0x18,2);
  auVar200[0] = (char)uVar191;
  auVar200[0xf] = 0;
  uVar191 = *(undefined8 *)u;
  auVar153[10] = 0;
  auVar153._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar153[0xb] = (char)((ulong)uVar191 >> 0x28);
  auVar165[9] = (char)((ulong)uVar191 >> 0x20);
  auVar165._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar165._10_2_ = auVar153._10_2_;
  auVar177._9_3_ = auVar165._9_3_;
  auVar177._0_9_ = (unkuint9)0;
  auVar131._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar177._8_4_,(char)((ulong)uVar191 >> 0x18))) << 0x38,6);
  auVar131[0] = (char)((ulong)uVar191 >> 0x10);
  auVar131._11_5_ = 0;
  auVar130._1_12_ = SUB1612(auVar131 << 0x28,4);
  auVar130[0] = (char)((ulong)uVar191 >> 8);
  auVar130._13_3_ = 0;
  auVar218._1_14_ = SUB1614(auVar130 << 0x18,2);
  auVar218[0] = (char)uVar191;
  auVar218[0xf] = 0;
  uVar191 = *(undefined8 *)v;
  auVar154[10] = 0;
  auVar154._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar154[0xb] = (char)((ulong)uVar191 >> 0x28);
  auVar166[9] = (char)((ulong)uVar191 >> 0x20);
  auVar166._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar166._10_2_ = auVar154._10_2_;
  auVar178._9_3_ = auVar166._9_3_;
  auVar178._0_9_ = (unkuint9)0;
  auVar133._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar178._8_4_,(char)((ulong)uVar191 >> 0x18))) << 0x38,6);
  auVar133[0] = (char)((ulong)uVar191 >> 0x10);
  auVar133._11_5_ = 0;
  auVar132._1_12_ = SUB1612(auVar133 << 0x28,4);
  auVar132[0] = (char)((ulong)uVar191 >> 8);
  auVar132._13_3_ = 0;
  auVar306._1_14_ = SUB1614(auVar132 << 0x18,2);
  auVar306[0] = (char)uVar191;
  auVar306[0xf] = 0;
  auVar200 = pmulhuw(auVar200 << 8,_DAT_001b7930);
  auVar339 = pmulhuw(auVar306 << 8,_DAT_001b7940);
  auVar340._0_2_ = auVar339._0_2_ + auVar200._0_2_ + -0x379a;
  auVar340._2_2_ = auVar339._2_2_ + auVar200._2_2_ + -0x379a;
  auVar340._4_2_ = auVar339._4_2_ + auVar200._4_2_ + -0x379a;
  auVar340._6_2_ = auVar339._6_2_ + auVar200._6_2_ + -0x379a;
  auVar340._8_2_ = auVar339._8_2_ + auVar200._8_2_ + -0x379a;
  auVar340._10_2_ = auVar339._10_2_ + auVar200._10_2_ + -0x379a;
  auVar340._12_2_ = auVar339._12_2_ + auVar200._12_2_ + -0x379a;
  auVar340._14_2_ = auVar339._14_2_ + auVar200._14_2_ + -0x379a;
  auVar339 = pmulhuw(auVar218 << 8,_DAT_001b7960);
  auVar306 = pmulhuw(auVar306 << 8,_DAT_001b7970);
  auVar218 = pmulhuw(auVar218 << 8,_DAT_001b7990);
  auVar218 = paddusw(auVar218,auVar200);
  auVar201._0_2_ = (auVar200._0_2_ - (auVar306._0_2_ + auVar339._0_2_)) + 0x2204;
  auVar201._2_2_ = (auVar200._2_2_ - (auVar306._2_2_ + auVar339._2_2_)) + 0x2204;
  auVar201._4_2_ = (auVar200._4_2_ - (auVar306._4_2_ + auVar339._4_2_)) + 0x2204;
  auVar201._6_2_ = (auVar200._6_2_ - (auVar306._6_2_ + auVar339._6_2_)) + 0x2204;
  auVar201._8_2_ = (auVar200._8_2_ - (auVar306._8_2_ + auVar339._8_2_)) + 0x2204;
  auVar201._10_2_ = (auVar200._10_2_ - (auVar306._10_2_ + auVar339._10_2_)) + 0x2204;
  auVar201._12_2_ = (auVar200._12_2_ - (auVar306._12_2_ + auVar339._12_2_)) + 0x2204;
  auVar201._14_2_ = (auVar200._14_2_ - (auVar306._14_2_ + auVar339._14_2_)) + 0x2204;
  auVar218 = psubusw(auVar218,_DAT_001b79a0);
  auVar306 = psraw(auVar340,6);
  auVar200 = psraw(auVar201,6);
  uVar206 = auVar218._0_2_ >> 6;
  uVar223 = auVar218._2_2_ >> 6;
  uVar224 = auVar218._4_2_ >> 6;
  uVar225 = auVar218._6_2_ >> 6;
  uVar226 = auVar218._8_2_ >> 6;
  uVar227 = auVar218._10_2_ >> 6;
  uVar228 = auVar218._12_2_ >> 6;
  uVar229 = auVar218._14_2_ >> 6;
  uVar191 = *(undefined8 *)(y + 8);
  auVar155[10] = 0;
  auVar155._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar155[0xb] = (char)((ulong)uVar191 >> 0x28);
  auVar167[9] = (char)((ulong)uVar191 >> 0x20);
  auVar167._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar167._10_2_ = auVar155._10_2_;
  auVar179._9_3_ = auVar167._9_3_;
  auVar179._0_9_ = (unkuint9)0;
  auVar135._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar179._8_4_,(char)((ulong)uVar191 >> 0x18))) << 0x38,6);
  auVar135[0] = (char)((ulong)uVar191 >> 0x10);
  auVar135._11_5_ = 0;
  auVar134._1_12_ = SUB1612(auVar135 << 0x28,4);
  auVar134[0] = (char)((ulong)uVar191 >> 8);
  auVar134._13_3_ = 0;
  auVar339._1_14_ = SUB1614(auVar134 << 0x18,2);
  auVar339[0] = (char)uVar191;
  auVar339[0xf] = 0;
  uVar191 = *(undefined8 *)(u + 8);
  auVar156[10] = 0;
  auVar156._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar156[0xb] = (char)((ulong)uVar191 >> 0x28);
  auVar168[9] = (char)((ulong)uVar191 >> 0x20);
  auVar168._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar168._10_2_ = auVar156._10_2_;
  auVar180._9_3_ = auVar168._9_3_;
  auVar180._0_9_ = (unkuint9)0;
  auVar137._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar180._8_4_,(char)((ulong)uVar191 >> 0x18))) << 0x38,6);
  auVar137[0] = (char)((ulong)uVar191 >> 0x10);
  auVar137._11_5_ = 0;
  auVar136._1_12_ = SUB1612(auVar137 << 0x28,4);
  auVar136[0] = (char)((ulong)uVar191 >> 8);
  auVar136._13_3_ = 0;
  auVar365._1_14_ = SUB1614(auVar136 << 0x18,2);
  auVar365[0] = (char)uVar191;
  auVar365[0xf] = 0;
  uVar191 = *(undefined8 *)(v + 8);
  auVar157[10] = 0;
  auVar157._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar157[0xb] = (char)((ulong)uVar191 >> 0x28);
  auVar169[9] = (char)((ulong)uVar191 >> 0x20);
  auVar169._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar169._10_2_ = auVar157._10_2_;
  auVar181._9_3_ = auVar169._9_3_;
  auVar181._0_9_ = (unkuint9)0;
  auVar139._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar181._8_4_,(char)((ulong)uVar191 >> 0x18))) << 0x38,6);
  auVar139[0] = (char)((ulong)uVar191 >> 0x10);
  auVar139._11_5_ = 0;
  auVar138._1_12_ = SUB1612(auVar139 << 0x28,4);
  auVar138[0] = (char)((ulong)uVar191 >> 8);
  auVar138._13_3_ = 0;
  auVar364._1_14_ = SUB1614(auVar138 << 0x18,2);
  auVar364[0] = (char)uVar191;
  auVar364[0xf] = 0;
  auVar339 = pmulhuw(auVar339 << 8,_DAT_001b7930);
  auVar218 = pmulhuw(auVar364 << 8,_DAT_001b7940);
  auVar361._0_2_ = auVar218._0_2_ + auVar339._0_2_ + -0x379a;
  auVar361._2_2_ = auVar218._2_2_ + auVar339._2_2_ + -0x379a;
  auVar361._4_2_ = auVar218._4_2_ + auVar339._4_2_ + -0x379a;
  auVar361._6_2_ = auVar218._6_2_ + auVar339._6_2_ + -0x379a;
  auVar361._8_2_ = auVar218._8_2_ + auVar339._8_2_ + -0x379a;
  auVar361._10_2_ = auVar218._10_2_ + auVar339._10_2_ + -0x379a;
  auVar361._12_2_ = auVar218._12_2_ + auVar339._12_2_ + -0x379a;
  auVar361._14_2_ = auVar218._14_2_ + auVar339._14_2_ + -0x379a;
  auVar366 = pmulhuw(auVar365 << 8,_DAT_001b7960);
  auVar364 = pmulhuw(auVar364 << 8,_DAT_001b7970);
  auVar218 = pmulhuw(auVar365 << 8,_DAT_001b7990);
  auVar218 = paddusw(auVar218,auVar339);
  auVar357._0_2_ = (auVar339._0_2_ - (auVar364._0_2_ + auVar366._0_2_)) + 0x2204;
  auVar357._2_2_ = (auVar339._2_2_ - (auVar364._2_2_ + auVar366._2_2_)) + 0x2204;
  auVar357._4_2_ = (auVar339._4_2_ - (auVar364._4_2_ + auVar366._4_2_)) + 0x2204;
  auVar357._6_2_ = (auVar339._6_2_ - (auVar364._6_2_ + auVar366._6_2_)) + 0x2204;
  auVar357._8_2_ = (auVar339._8_2_ - (auVar364._8_2_ + auVar366._8_2_)) + 0x2204;
  auVar357._10_2_ = (auVar339._10_2_ - (auVar364._10_2_ + auVar366._10_2_)) + 0x2204;
  auVar357._12_2_ = (auVar339._12_2_ - (auVar364._12_2_ + auVar366._12_2_)) + 0x2204;
  auVar357._14_2_ = (auVar339._14_2_ - (auVar364._14_2_ + auVar366._14_2_)) + 0x2204;
  auVar218 = psubusw(auVar218,_DAT_001b79a0);
  auVar339 = psraw(auVar361,6);
  sVar76 = auVar306._0_2_;
  sVar77 = auVar306._2_2_;
  bVar1 = (0 < sVar77) * (sVar77 < 0x100) * auVar306[2] - (0xff < sVar77);
  sVar77 = auVar306._4_2_;
  sVar84 = auVar306._6_2_;
  cVar2 = (0 < sVar84) * (sVar84 < 0x100) * auVar306[6] - (0xff < sVar84);
  uVar260 = CONCAT13(cVar2,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar306[4] - (0xff < sVar77),
                                    CONCAT11(bVar1,(0 < sVar76) * (sVar76 < 0x100) * auVar306[0] -
                                                   (0xff < sVar76))));
  sVar76 = auVar306._8_2_;
  sVar77 = auVar306._10_2_;
  cVar3 = (0 < sVar77) * (sVar77 < 0x100) * auVar306[10] - (0xff < sVar77);
  uVar261 = CONCAT15(cVar3,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar306[8] - (0xff < sVar76),
                                    uVar260));
  sVar76 = auVar306._12_2_;
  sVar77 = auVar306._14_2_;
  cVar4 = (0 < sVar77) * (sVar77 < 0x100) * auVar306[0xe] - (0xff < sVar77);
  uVar262 = CONCAT17(cVar4,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar306[0xc] -
                                    (0xff < sVar76),uVar261));
  sVar76 = auVar339._0_2_;
  sVar77 = auVar339._2_2_;
  cVar5 = (0 < sVar77) * (sVar77 < 0x100) * auVar339[2] - (0xff < sVar77);
  auVar335._0_10_ =
       CONCAT19(cVar5,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar339[0] - (0xff < sVar76),
                               uVar262));
  sVar76 = auVar339._4_2_;
  auVar335[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar339[4] - (0xff < sVar76);
  sVar76 = auVar339._6_2_;
  cVar6 = (0 < sVar76) * (sVar76 < 0x100) * auVar339[6] - (0xff < sVar76);
  auVar335[0xb] = cVar6;
  sVar76 = auVar339._8_2_;
  auVar337[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar339[8] - (0xff < sVar76);
  auVar337._0_12_ = auVar335;
  sVar76 = auVar339._10_2_;
  cVar7 = (0 < sVar76) * (sVar76 < 0x100) * auVar339[10] - (0xff < sVar76);
  auVar337[0xd] = cVar7;
  sVar76 = auVar339._12_2_;
  auVar341[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar339[0xc] - (0xff < sVar76);
  auVar341._0_14_ = auVar337;
  sVar76 = auVar339._14_2_;
  cVar8 = (0 < sVar76) * (sVar76 < 0x100) * auVar339[0xe] - (0xff < sVar76);
  auVar341[0xf] = cVar8;
  auVar306 = psraw(auVar357,6);
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  bVar9 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  sVar77 = auVar200._4_2_;
  sVar84 = auVar200._6_2_;
  cVar10 = (0 < sVar84) * (sVar84 < 0x100) * auVar200[6] - (0xff < sVar84);
  uVar188 = CONCAT13(cVar10,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar200[4] - (0xff < sVar77)
                                     ,CONCAT11(bVar9,(0 < sVar76) * (sVar76 < 0x100) * auVar200[0] -
                                                     (0xff < sVar76))));
  sVar76 = auVar200._8_2_;
  sVar77 = auVar200._10_2_;
  cVar11 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[10] - (0xff < sVar77);
  uVar189 = CONCAT15(cVar11,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76)
                                     ,uVar188));
  sVar76 = auVar200._12_2_;
  sVar77 = auVar200._14_2_;
  cVar12 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[0xe] - (0xff < sVar77);
  uVar190 = CONCAT17(cVar12,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] -
                                     (0xff < sVar76),uVar189));
  sVar76 = auVar306._0_2_;
  sVar77 = auVar306._2_2_;
  cVar13 = (0 < sVar77) * (sVar77 < 0x100) * auVar306[2] - (0xff < sVar77);
  auVar192._0_10_ =
       CONCAT19(cVar13,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar306[0] - (0xff < sVar76),
                                uVar190));
  sVar76 = auVar306._4_2_;
  auVar192[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar306[4] - (0xff < sVar76);
  sVar76 = auVar306._6_2_;
  cVar14 = (0 < sVar76) * (sVar76 < 0x100) * auVar306[6] - (0xff < sVar76);
  auVar192[0xb] = cVar14;
  sVar76 = auVar306._8_2_;
  auVar196[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar306[8] - (0xff < sVar76);
  auVar196._0_12_ = auVar192;
  sVar76 = auVar306._10_2_;
  cVar15 = (0 < sVar76) * (sVar76 < 0x100) * auVar306[10] - (0xff < sVar76);
  auVar196[0xd] = cVar15;
  sVar76 = auVar306._12_2_;
  auVar202[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar306[0xc] - (0xff < sVar76);
  auVar202._0_14_ = auVar196;
  sVar76 = auVar306._14_2_;
  cVar16 = (0 < sVar76) * (sVar76 < 0x100) * auVar306[0xe] - (0xff < sVar76);
  auVar202[0xf] = cVar16;
  uVar343 = auVar218._0_2_ >> 6;
  uVar348 = auVar218._2_2_ >> 6;
  uVar349 = auVar218._4_2_ >> 6;
  uVar350 = auVar218._6_2_ >> 6;
  uVar351 = auVar218._8_2_ >> 6;
  uVar352 = auVar218._10_2_ >> 6;
  uVar353 = auVar218._12_2_ >> 6;
  uVar354 = auVar218._14_2_ >> 6;
  bVar17 = (uVar223 != 0) * (uVar223 < 0x100) * (char)uVar223 - (0xff < uVar223);
  cVar18 = (uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225);
  uVar207 = CONCAT13(cVar18,CONCAT12((uVar224 != 0) * (uVar224 < 0x100) * (char)uVar224 -
                                     (0xff < uVar224),
                                     CONCAT11(bVar17,(uVar206 != 0) * (uVar206 < 0x100) *
                                                     (char)uVar206 - (0xff < uVar206))));
  cVar19 = (uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 - (0xff < uVar227);
  uVar208 = CONCAT15(cVar19,CONCAT14((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 -
                                     (0xff < uVar226),uVar207));
  cVar20 = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
  uVar209 = CONCAT17(cVar20,CONCAT16((uVar228 != 0) * (uVar228 < 0x100) * (char)uVar228 -
                                     (0xff < uVar228),uVar208));
  cVar21 = (uVar348 != 0) * (uVar348 < 0x100) * (char)uVar348 - (0xff < uVar348);
  auVar210._0_10_ =
       CONCAT19(cVar21,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * (char)uVar343 -
                                (0xff < uVar343),uVar209));
  auVar210[10] = (uVar349 != 0) * (uVar349 < 0x100) * (char)uVar349 - (0xff < uVar349);
  cVar22 = (uVar350 != 0) * (uVar350 < 0x100) * (char)uVar350 - (0xff < uVar350);
  auVar210[0xb] = cVar22;
  auVar214[0xc] = (uVar351 != 0) * (uVar351 < 0x100) * (char)uVar351 - (0xff < uVar351);
  auVar214._0_12_ = auVar210;
  cVar23 = (uVar352 != 0) * (uVar352 < 0x100) * (char)uVar352 - (0xff < uVar352);
  auVar214[0xd] = cVar23;
  auVar219[0xe] = (uVar353 != 0) * (uVar353 < 0x100) * (char)uVar353 - (0xff < uVar353);
  auVar219._0_14_ = auVar214;
  cVar24 = (uVar354 != 0) * (uVar354 < 0x100) * (char)uVar354 - (0xff < uVar354);
  auVar219[0xf] = cVar24;
  uVar191 = *(undefined8 *)(y + 0x10);
  auVar158[10] = 0;
  auVar158._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar158[0xb] = (char)((ulong)uVar191 >> 0x28);
  auVar170[9] = (char)((ulong)uVar191 >> 0x20);
  auVar170._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar170._10_2_ = auVar158._10_2_;
  auVar182._9_3_ = auVar170._9_3_;
  auVar182._0_9_ = (unkuint9)0;
  auVar141._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar182._8_4_,(char)((ulong)uVar191 >> 0x18))) << 0x38,6);
  auVar141[0] = (char)((ulong)uVar191 >> 0x10);
  auVar141._11_5_ = 0;
  auVar140._1_12_ = SUB1612(auVar141 << 0x28,4);
  auVar140[0] = (char)((ulong)uVar191 >> 8);
  auVar140._13_3_ = 0;
  auVar366._1_14_ = SUB1614(auVar140 << 0x18,2);
  auVar366[0] = (char)uVar191;
  auVar366[0xf] = 0;
  uVar191 = *(undefined8 *)(u + 0x10);
  auVar159[10] = 0;
  auVar159._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar159[0xb] = (char)((ulong)uVar191 >> 0x28);
  auVar171[9] = (char)((ulong)uVar191 >> 0x20);
  auVar171._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar171._10_2_ = auVar159._10_2_;
  auVar183._9_3_ = auVar171._9_3_;
  auVar183._0_9_ = (unkuint9)0;
  auVar143._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar183._8_4_,(char)((ulong)uVar191 >> 0x18))) << 0x38,6);
  auVar143[0] = (char)((ulong)uVar191 >> 0x10);
  auVar143._11_5_ = 0;
  auVar142._1_12_ = SUB1612(auVar143 << 0x28,4);
  auVar142[0] = (char)((ulong)uVar191 >> 8);
  auVar142._13_3_ = 0;
  auVar367._1_14_ = SUB1614(auVar142 << 0x18,2);
  auVar367[0] = (char)uVar191;
  auVar367[0xf] = 0;
  uVar191 = *(undefined8 *)(v + 0x10);
  auVar160[10] = 0;
  auVar160._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar160[0xb] = (char)((ulong)uVar191 >> 0x28);
  auVar172[9] = (char)((ulong)uVar191 >> 0x20);
  auVar172._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar172._10_2_ = auVar160._10_2_;
  auVar184._9_3_ = auVar172._9_3_;
  auVar184._0_9_ = (unkuint9)0;
  auVar145._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar184._8_4_,(char)((ulong)uVar191 >> 0x18))) << 0x38,6);
  auVar145[0] = (char)((ulong)uVar191 >> 0x10);
  auVar145._11_5_ = 0;
  auVar144._1_12_ = SUB1612(auVar145 << 0x28,4);
  auVar144[0] = (char)((ulong)uVar191 >> 8);
  auVar144._13_3_ = 0;
  auVar124._1_14_ = SUB1614(auVar144 << 0x18,2);
  auVar124[0] = (char)uVar191;
  auVar124[0xf] = 0;
  auVar339 = pmulhuw(auVar366 << 8,_DAT_001b7930);
  auVar200 = pmulhuw(auVar124 << 8,_DAT_001b7940);
  auVar366 = pmulhuw(auVar367 << 8,_DAT_001b7960);
  auVar365 = pmulhuw(auVar124 << 8,_DAT_001b7970);
  auVar218 = pmulhuw(auVar367 << 8,_DAT_001b7990);
  auVar306 = paddusw(auVar218,auVar339);
  uVar191 = *(undefined8 *)(y + 0x18);
  auVar161[10] = 0;
  auVar161._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar161[0xb] = (char)((ulong)uVar191 >> 0x28);
  auVar173[9] = (char)((ulong)uVar191 >> 0x20);
  auVar173._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar173._10_2_ = auVar161._10_2_;
  auVar185._9_3_ = auVar173._9_3_;
  auVar185._0_9_ = (unkuint9)0;
  auVar147._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar185._8_4_,(char)((ulong)uVar191 >> 0x18))) << 0x38,6);
  auVar147[0] = (char)((ulong)uVar191 >> 0x10);
  auVar147._11_5_ = 0;
  auVar146._1_12_ = SUB1612(auVar147 << 0x28,4);
  auVar146[0] = (char)((ulong)uVar191 >> 8);
  auVar146._13_3_ = 0;
  auVar125._1_14_ = SUB1614(auVar146 << 0x18,2);
  auVar125[0] = (char)uVar191;
  auVar125[0xf] = 0;
  uVar191 = *(undefined8 *)(u + 0x18);
  auVar162[10] = 0;
  auVar162._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar162[0xb] = (char)((ulong)uVar191 >> 0x28);
  auVar174[9] = (char)((ulong)uVar191 >> 0x20);
  auVar174._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar174._10_2_ = auVar162._10_2_;
  auVar186._9_3_ = auVar174._9_3_;
  auVar186._0_9_ = (unkuint9)0;
  auVar149._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar186._8_4_,(char)((ulong)uVar191 >> 0x18))) << 0x38,6);
  auVar149[0] = (char)((ulong)uVar191 >> 0x10);
  auVar149._11_5_ = 0;
  auVar148._1_12_ = SUB1612(auVar149 << 0x28,4);
  auVar148[0] = (char)((ulong)uVar191 >> 8);
  auVar148._13_3_ = 0;
  auVar126._1_14_ = SUB1614(auVar148 << 0x18,2);
  auVar126[0] = (char)uVar191;
  auVar126[0xf] = 0;
  uVar191 = *(undefined8 *)(v + 0x18);
  auVar163[10] = 0;
  auVar163._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar163[0xb] = (char)((ulong)uVar191 >> 0x28);
  auVar175[9] = (char)((ulong)uVar191 >> 0x20);
  auVar175._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar175._10_2_ = auVar163._10_2_;
  auVar187._9_3_ = auVar175._9_3_;
  auVar187._0_9_ = (unkuint9)0;
  auVar151._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar187._8_4_,(char)((ulong)uVar191 >> 0x18))) << 0x38,6);
  auVar151[0] = (char)((ulong)uVar191 >> 0x10);
  auVar151._11_5_ = 0;
  auVar150._1_12_ = SUB1612(auVar151 << 0x28,4);
  auVar150[0] = (char)((ulong)uVar191 >> 8);
  auVar150._13_3_ = 0;
  auVar127._1_14_ = SUB1614(auVar150 << 0x18,2);
  auVar127[0] = (char)uVar191;
  auVar127[0xf] = 0;
  auVar367 = pmulhuw(auVar125 << 8,_DAT_001b7930);
  auVar346._0_2_ = auVar200._0_2_ + auVar339._0_2_ + -0x379a;
  auVar346._2_2_ = auVar200._2_2_ + auVar339._2_2_ + -0x379a;
  auVar346._4_2_ = auVar200._4_2_ + auVar339._4_2_ + -0x379a;
  auVar346._6_2_ = auVar200._6_2_ + auVar339._6_2_ + -0x379a;
  auVar346._8_2_ = auVar200._8_2_ + auVar339._8_2_ + -0x379a;
  auVar346._10_2_ = auVar200._10_2_ + auVar339._10_2_ + -0x379a;
  auVar346._12_2_ = auVar200._12_2_ + auVar339._12_2_ + -0x379a;
  auVar346._14_2_ = auVar200._14_2_ + auVar339._14_2_ + -0x379a;
  auVar200 = pmulhuw(_DAT_001b7940,auVar127 << 8);
  auVar246._0_2_ = auVar200._0_2_ + auVar367._0_2_ + -0x379a;
  auVar246._2_2_ = auVar200._2_2_ + auVar367._2_2_ + -0x379a;
  auVar246._4_2_ = auVar200._4_2_ + auVar367._4_2_ + -0x379a;
  auVar246._6_2_ = auVar200._6_2_ + auVar367._6_2_ + -0x379a;
  auVar246._8_2_ = auVar200._8_2_ + auVar367._8_2_ + -0x379a;
  auVar246._10_2_ = auVar200._10_2_ + auVar367._10_2_ + -0x379a;
  auVar246._12_2_ = auVar200._12_2_ + auVar367._12_2_ + -0x379a;
  auVar246._14_2_ = auVar200._14_2_ + auVar367._14_2_ + -0x379a;
  auVar200 = pmulhuw(auVar127 << 8,_DAT_001b7970);
  auVar218 = pmulhuw(_DAT_001b7960,auVar126 << 8);
  auVar364 = pmulhuw(auVar126 << 8,_DAT_001b7990);
  auVar364 = paddusw(auVar364,auVar367);
  auVar362._0_2_ = (auVar339._0_2_ - (auVar365._0_2_ + auVar366._0_2_)) + 0x2204;
  auVar362._2_2_ = (auVar339._2_2_ - (auVar365._2_2_ + auVar366._2_2_)) + 0x2204;
  auVar362._4_2_ = (auVar339._4_2_ - (auVar365._4_2_ + auVar366._4_2_)) + 0x2204;
  auVar362._6_2_ = (auVar339._6_2_ - (auVar365._6_2_ + auVar366._6_2_)) + 0x2204;
  auVar362._8_2_ = (auVar339._8_2_ - (auVar365._8_2_ + auVar366._8_2_)) + 0x2204;
  auVar362._10_2_ = (auVar339._10_2_ - (auVar365._10_2_ + auVar366._10_2_)) + 0x2204;
  auVar362._12_2_ = (auVar339._12_2_ - (auVar365._12_2_ + auVar366._12_2_)) + 0x2204;
  auVar362._14_2_ = (auVar339._14_2_ - (auVar365._14_2_ + auVar366._14_2_)) + 0x2204;
  auVar339 = psubusw(auVar306,_DAT_001b79a0);
  auVar306 = psraw(auVar346,6);
  auVar365 = psraw(auVar362,6);
  uVar206 = auVar339._0_2_ >> 6;
  uVar223 = auVar339._2_2_ >> 6;
  uVar224 = auVar339._4_2_ >> 6;
  uVar225 = auVar339._6_2_ >> 6;
  uVar226 = auVar339._8_2_ >> 6;
  uVar227 = auVar339._10_2_ >> 6;
  uVar228 = auVar339._12_2_ >> 6;
  uVar229 = auVar339._14_2_ >> 6;
  auVar368._0_2_ = (auVar367._0_2_ - (auVar200._0_2_ + auVar218._0_2_)) + 0x2204;
  auVar368._2_2_ = (auVar367._2_2_ - (auVar200._2_2_ + auVar218._2_2_)) + 0x2204;
  auVar368._4_2_ = (auVar367._4_2_ - (auVar200._4_2_ + auVar218._4_2_)) + 0x2204;
  auVar368._6_2_ = (auVar367._6_2_ - (auVar200._6_2_ + auVar218._6_2_)) + 0x2204;
  auVar368._8_2_ = (auVar367._8_2_ - (auVar200._8_2_ + auVar218._8_2_)) + 0x2204;
  auVar368._10_2_ = (auVar367._10_2_ - (auVar200._10_2_ + auVar218._10_2_)) + 0x2204;
  auVar368._12_2_ = (auVar367._12_2_ - (auVar200._12_2_ + auVar218._12_2_)) + 0x2204;
  auVar368._14_2_ = (auVar367._14_2_ - (auVar200._14_2_ + auVar218._14_2_)) + 0x2204;
  auVar218 = psubusw(auVar364,_DAT_001b79a0);
  auVar200 = psraw(auVar246,6);
  sVar76 = auVar306._0_2_;
  sVar77 = auVar306._2_2_;
  bVar25 = (0 < sVar77) * (sVar77 < 0x100) * auVar306[2] - (0xff < sVar77);
  sVar77 = auVar306._4_2_;
  sVar84 = auVar306._6_2_;
  cVar26 = (0 < sVar84) * (sVar84 < 0x100) * auVar306[6] - (0xff < sVar84);
  uVar299 = CONCAT13(cVar26,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar306[4] - (0xff < sVar77)
                                     ,CONCAT11(bVar25,(0 < sVar76) * (sVar76 < 0x100) * auVar306[0]
                                                      - (0xff < sVar76))));
  sVar76 = auVar306._8_2_;
  sVar77 = auVar306._10_2_;
  cVar27 = (0 < sVar77) * (sVar77 < 0x100) * auVar306[10] - (0xff < sVar77);
  uVar300 = CONCAT15(cVar27,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar306[8] - (0xff < sVar76)
                                     ,uVar299));
  sVar76 = auVar306._12_2_;
  sVar77 = auVar306._14_2_;
  cVar28 = (0 < sVar77) * (sVar77 < 0x100) * auVar306[0xe] - (0xff < sVar77);
  uVar301 = CONCAT17(cVar28,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar306[0xc] -
                                     (0xff < sVar76),uVar300));
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  cVar29 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  auVar344._0_10_ =
       CONCAT19(cVar29,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar200[0] - (0xff < sVar76),
                                uVar301));
  sVar76 = auVar200._4_2_;
  auVar344[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[4] - (0xff < sVar76);
  sVar76 = auVar200._6_2_;
  cVar30 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[6] - (0xff < sVar76);
  auVar344[0xb] = cVar30;
  sVar76 = auVar200._8_2_;
  auVar345[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76);
  auVar345._0_12_ = auVar344;
  sVar76 = auVar200._10_2_;
  cVar31 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[10] - (0xff < sVar76);
  auVar345[0xd] = cVar31;
  sVar76 = auVar200._12_2_;
  auVar347[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] - (0xff < sVar76);
  auVar347._0_14_ = auVar345;
  sVar76 = auVar200._14_2_;
  cVar32 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xe] - (0xff < sVar76);
  auVar347[0xf] = cVar32;
  auVar200 = psraw(auVar368,6);
  sVar76 = auVar365._0_2_;
  sVar77 = auVar365._2_2_;
  bVar33 = (0 < sVar77) * (sVar77 < 0x100) * auVar365[2] - (0xff < sVar77);
  sVar77 = auVar365._4_2_;
  sVar84 = auVar365._6_2_;
  cVar34 = (0 < sVar84) * (sVar84 < 0x100) * auVar365[6] - (0xff < sVar84);
  uVar319 = CONCAT13(cVar34,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar365[4] - (0xff < sVar77)
                                     ,CONCAT11(bVar33,(0 < sVar76) * (sVar76 < 0x100) * auVar365[0]
                                                      - (0xff < sVar76))));
  sVar76 = auVar365._8_2_;
  sVar77 = auVar365._10_2_;
  cVar35 = (0 < sVar77) * (sVar77 < 0x100) * auVar365[10] - (0xff < sVar77);
  uVar320 = CONCAT15(cVar35,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar365[8] - (0xff < sVar76)
                                     ,uVar319));
  sVar76 = auVar365._12_2_;
  sVar77 = auVar365._14_2_;
  cVar36 = (0 < sVar77) * (sVar77 < 0x100) * auVar365[0xe] - (0xff < sVar77);
  uVar321 = CONCAT17(cVar36,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar365[0xc] -
                                     (0xff < sVar76),uVar320));
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  cVar37 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  auVar359._0_10_ =
       CONCAT19(cVar37,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar200[0] - (0xff < sVar76),
                                uVar321));
  sVar76 = auVar200._4_2_;
  auVar359[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[4] - (0xff < sVar76);
  sVar76 = auVar200._6_2_;
  cVar38 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[6] - (0xff < sVar76);
  auVar359[0xb] = cVar38;
  sVar76 = auVar200._8_2_;
  auVar360[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76);
  auVar360._0_12_ = auVar359;
  sVar76 = auVar200._10_2_;
  cVar39 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[10] - (0xff < sVar76);
  auVar360[0xd] = cVar39;
  sVar76 = auVar200._12_2_;
  auVar363[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] - (0xff < sVar76);
  auVar363._0_14_ = auVar360;
  sVar76 = auVar200._14_2_;
  cVar40 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xe] - (0xff < sVar76);
  auVar363[0xf] = cVar40;
  uVar343 = auVar218._0_2_ >> 6;
  uVar348 = auVar218._2_2_ >> 6;
  uVar349 = auVar218._4_2_ >> 6;
  uVar350 = auVar218._6_2_ >> 6;
  uVar351 = auVar218._8_2_ >> 6;
  uVar352 = auVar218._10_2_ >> 6;
  uVar353 = auVar218._12_2_ >> 6;
  uVar354 = auVar218._14_2_ >> 6;
  bVar41 = (uVar223 != 0) * (uVar223 < 0x100) * (char)uVar223 - (0xff < uVar223);
  cVar42 = (uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225);
  uVar309 = CONCAT13(cVar42,CONCAT12((uVar224 != 0) * (uVar224 < 0x100) * (char)uVar224 -
                                     (0xff < uVar224),
                                     CONCAT11(bVar41,(uVar206 != 0) * (uVar206 < 0x100) *
                                                     (char)uVar206 - (0xff < uVar206))));
  cVar43 = (uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 - (0xff < uVar227);
  uVar310 = CONCAT15(cVar43,CONCAT14((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 -
                                     (0xff < uVar226),uVar309));
  cVar44 = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
  uVar191 = CONCAT17(cVar44,CONCAT16((uVar228 != 0) * (uVar228 < 0x100) * (char)uVar228 -
                                     (0xff < uVar228),uVar310));
  cVar45 = (uVar348 != 0) * (uVar348 < 0x100) * (char)uVar348 - (0xff < uVar348);
  auVar355._0_10_ =
       CONCAT19(cVar45,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * (char)uVar343 -
                                (0xff < uVar343),uVar191));
  auVar355[10] = (uVar349 != 0) * (uVar349 < 0x100) * (char)uVar349 - (0xff < uVar349);
  cVar46 = (uVar350 != 0) * (uVar350 < 0x100) * (char)uVar350 - (0xff < uVar350);
  auVar355[0xb] = cVar46;
  auVar356[0xc] = (uVar351 != 0) * (uVar351 < 0x100) * (char)uVar351 - (0xff < uVar351);
  auVar356._0_12_ = auVar355;
  cVar47 = (uVar352 != 0) * (uVar352 < 0x100) * (char)uVar352 - (0xff < uVar352);
  auVar356[0xd] = cVar47;
  auVar358[0xe] = (uVar353 != 0) * (uVar353 < 0x100) * (char)uVar353 - (0xff < uVar353);
  auVar358._0_14_ = auVar356;
  cVar48 = (uVar354 != 0) * (uVar354 < 0x100) * (char)uVar354 - (0xff < uVar354);
  auVar358[0xf] = cVar48;
  auVar218 = auVar219 & _DAT_001b6830;
  auVar200 = auVar358 & _DAT_001b6830;
  sVar76 = auVar218._0_2_;
  sVar77 = auVar218._2_2_;
  bVar49 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[2] - (0xff < sVar77);
  sVar77 = auVar218._4_2_;
  sVar84 = auVar218._6_2_;
  cVar50 = (0 < sVar84) * (sVar84 < 0x100) * auVar218[6] - (0xff < sVar84);
  uVar247 = CONCAT13(cVar50,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar218[4] - (0xff < sVar77)
                                     ,CONCAT11(bVar49,(0 < sVar76) * (sVar76 < 0x100) * auVar218[0]
                                                      - (0xff < sVar76))));
  sVar76 = auVar218._8_2_;
  sVar77 = auVar218._10_2_;
  cVar51 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[10] - (0xff < sVar77);
  uVar248 = CONCAT15(cVar51,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar218[8] - (0xff < sVar76)
                                     ,uVar247));
  sVar76 = auVar218._12_2_;
  sVar77 = auVar218._14_2_;
  cVar52 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[0xe] - (0xff < sVar77);
  uVar282 = CONCAT17(cVar52,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar218[0xc] -
                                     (0xff < sVar76),uVar248));
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  cVar53 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  auVar283._0_10_ =
       CONCAT19(cVar53,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar200[0] - (0xff < sVar76),
                                uVar282));
  sVar76 = auVar200._4_2_;
  auVar283[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[4] - (0xff < sVar76);
  sVar76 = auVar200._6_2_;
  cVar54 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[6] - (0xff < sVar76);
  auVar283[0xb] = cVar54;
  sVar76 = auVar200._8_2_;
  auVar286[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76);
  auVar286._0_12_ = auVar283;
  sVar76 = auVar200._10_2_;
  cVar55 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[10] - (0xff < sVar76);
  auVar286[0xd] = cVar55;
  sVar76 = auVar200._12_2_;
  auVar289[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] - (0xff < sVar76);
  auVar289._0_14_ = auVar286;
  sVar76 = auVar200._14_2_;
  cVar56 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xe] - (0xff < sVar76);
  auVar289[0xf] = cVar56;
  auVar218 = auVar202 & _DAT_001b6830;
  auVar200 = auVar363 & _DAT_001b6830;
  sVar76 = auVar218._0_2_;
  sVar77 = auVar218._2_2_;
  bVar57 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[2] - (0xff < sVar77);
  sVar77 = auVar218._4_2_;
  sVar84 = auVar218._6_2_;
  cVar58 = (0 < sVar84) * (sVar84 < 0x100) * auVar218[6] - (0xff < sVar84);
  uVar280 = CONCAT13(cVar58,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar218[4] - (0xff < sVar77)
                                     ,CONCAT11(bVar57,(0 < sVar76) * (sVar76 < 0x100) * auVar218[0]
                                                      - (0xff < sVar76))));
  sVar76 = auVar218._8_2_;
  sVar77 = auVar218._10_2_;
  cVar59 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[10] - (0xff < sVar77);
  uVar281 = CONCAT15(cVar59,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar218[8] - (0xff < sVar76)
                                     ,uVar280));
  sVar76 = auVar218._12_2_;
  sVar77 = auVar218._14_2_;
  cVar60 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[0xe] - (0xff < sVar77);
  uVar311 = CONCAT17(cVar60,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar218[0xc] -
                                     (0xff < sVar76),uVar281));
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  cVar61 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  auVar312._0_10_ =
       CONCAT19(cVar61,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar200[0] - (0xff < sVar76),
                                uVar311));
  sVar76 = auVar200._4_2_;
  auVar312[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[4] - (0xff < sVar76);
  sVar76 = auVar200._6_2_;
  cVar62 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[6] - (0xff < sVar76);
  auVar312[0xb] = cVar62;
  sVar76 = auVar200._8_2_;
  auVar314[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76);
  auVar314._0_12_ = auVar312;
  sVar76 = auVar200._10_2_;
  cVar63 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[10] - (0xff < sVar76);
  auVar314[0xd] = cVar63;
  sVar76 = auVar200._12_2_;
  auVar316[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] - (0xff < sVar76);
  auVar316._0_14_ = auVar314;
  sVar76 = auVar200._14_2_;
  cVar64 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xe] - (0xff < sVar76);
  auVar316[0xf] = cVar64;
  auVar218 = auVar341 & _DAT_001b6830;
  auVar200 = auVar347 & _DAT_001b6830;
  sVar76 = auVar218._0_2_;
  sVar77 = auVar218._2_2_;
  bVar65 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[2] - (0xff < sVar77);
  sVar77 = auVar218._4_2_;
  sVar84 = auVar218._6_2_;
  cVar66 = (0 < sVar84) * (sVar84 < 0x100) * auVar218[6] - (0xff < sVar84);
  uVar231 = CONCAT13(cVar66,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar218[4] - (0xff < sVar77)
                                     ,CONCAT11(bVar65,(0 < sVar76) * (sVar76 < 0x100) * auVar218[0]
                                                      - (0xff < sVar76))));
  sVar76 = auVar218._8_2_;
  sVar77 = auVar218._10_2_;
  cVar67 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[10] - (0xff < sVar77);
  uVar232 = CONCAT15(cVar67,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar218[8] - (0xff < sVar76)
                                     ,uVar231));
  sVar76 = auVar218._12_2_;
  sVar77 = auVar218._14_2_;
  cVar68 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[0xe] - (0xff < sVar77);
  uVar249 = CONCAT17(cVar68,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar218[0xc] -
                                     (0xff < sVar76),uVar232));
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  cVar69 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  auVar250._0_10_ =
       CONCAT19(cVar69,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar200[0] - (0xff < sVar76),
                                uVar249));
  sVar76 = auVar200._4_2_;
  auVar250[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[4] - (0xff < sVar76);
  sVar76 = auVar200._6_2_;
  cVar70 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[6] - (0xff < sVar76);
  auVar250[0xb] = cVar70;
  sVar76 = auVar200._8_2_;
  auVar253[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76);
  auVar253._0_12_ = auVar250;
  sVar76 = auVar200._10_2_;
  cVar71 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[10] - (0xff < sVar76);
  auVar253[0xd] = cVar71;
  sVar76 = auVar200._12_2_;
  auVar256[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] - (0xff < sVar76);
  auVar256._0_14_ = auVar253;
  sVar76 = auVar200._14_2_;
  cVar72 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xe] - (0xff < sVar76);
  auVar256[0xf] = cVar72;
  uVar206 = (ushort)bVar17;
  uVar223 = (ushort)((uint)uVar207 >> 0x18);
  uVar224 = (ushort)((uint6)uVar208 >> 0x28);
  uVar225 = (ushort)((ulong)uVar209 >> 0x38);
  uVar226 = (ushort)((unkuint10)auVar210._0_10_ >> 0x48);
  uVar227 = auVar210._10_2_ >> 8;
  uVar228 = auVar214._12_2_ >> 8;
  uVar229 = auVar219._14_2_ >> 8;
  uVar343 = (ushort)bVar41;
  uVar348 = (ushort)((uint)uVar309 >> 0x18);
  uVar349 = (ushort)((uint6)uVar310 >> 0x28);
  uVar350 = (ushort)((ulong)uVar191 >> 0x38);
  uVar351 = (ushort)((unkuint10)auVar355._0_10_ >> 0x48);
  uVar352 = auVar355._10_2_ >> 8;
  uVar353 = auVar356._12_2_ >> 8;
  uVar354 = auVar358._14_2_ >> 8;
  bVar73 = (uVar223 != 0) * (uVar223 < 0x100) * cVar18 - (0xff < uVar223);
  cVar74 = (uVar225 != 0) * (uVar225 < 0x100) * cVar20 - (0xff < uVar225);
  uVar207 = CONCAT13(cVar74,CONCAT12((uVar224 != 0) * (uVar224 < 0x100) * cVar19 - (0xff < uVar224),
                                     CONCAT11(bVar73,(uVar206 != 0) * (uVar206 < 0x100) * bVar17 -
                                                     (0xff < uVar206))));
  cVar75 = (uVar227 != 0) * (uVar227 < 0x100) * cVar22 - (0xff < uVar227);
  uVar208 = CONCAT15(cVar75,CONCAT14((uVar226 != 0) * (uVar226 < 0x100) * cVar21 - (0xff < uVar226),
                                     uVar207));
  cVar22 = (uVar229 != 0) * (uVar229 < 0x100) * cVar24 - (0xff < uVar229);
  uVar209 = CONCAT17(cVar22,CONCAT16((uVar228 != 0) * (uVar228 < 0x100) * cVar23 - (0xff < uVar228),
                                     uVar208));
  cVar21 = (uVar348 != 0) * (uVar348 < 0x100) * cVar42 - (0xff < uVar348);
  auVar211._0_10_ =
       CONCAT19(cVar21,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar41 - (0xff < uVar343),
                                uVar209));
  auVar211[10] = (uVar349 != 0) * (uVar349 < 0x100) * cVar43 - (0xff < uVar349);
  cVar20 = (uVar350 != 0) * (uVar350 < 0x100) * cVar44 - (0xff < uVar350);
  auVar211[0xb] = cVar20;
  auVar215[0xc] = (uVar351 != 0) * (uVar351 < 0x100) * cVar45 - (0xff < uVar351);
  auVar215._0_12_ = auVar211;
  cVar18 = (uVar352 != 0) * (uVar352 < 0x100) * cVar46 - (0xff < uVar352);
  auVar215[0xd] = cVar18;
  auVar220[0xe] = (uVar353 != 0) * (uVar353 < 0x100) * cVar47 - (0xff < uVar353);
  auVar220._0_14_ = auVar215;
  cVar19 = (uVar354 != 0) * (uVar354 < 0x100) * cVar48 - (0xff < uVar354);
  auVar220[0xf] = cVar19;
  uVar206 = (ushort)bVar9;
  uVar223 = (ushort)((uint)uVar188 >> 0x18);
  uVar224 = (ushort)((uint6)uVar189 >> 0x28);
  uVar225 = (ushort)((ulong)uVar190 >> 0x38);
  uVar226 = (ushort)((unkuint10)auVar192._0_10_ >> 0x48);
  uVar227 = auVar192._10_2_ >> 8;
  uVar228 = auVar196._12_2_ >> 8;
  uVar229 = auVar202._14_2_ >> 8;
  uVar343 = (ushort)bVar33;
  uVar348 = (ushort)((uint)uVar319 >> 0x18);
  uVar349 = (ushort)((uint6)uVar320 >> 0x28);
  uVar350 = (ushort)((ulong)uVar321 >> 0x38);
  uVar351 = (ushort)((unkuint10)auVar359._0_10_ >> 0x48);
  uVar352 = auVar359._10_2_ >> 8;
  uVar353 = auVar360._12_2_ >> 8;
  uVar354 = auVar363._14_2_ >> 8;
  bVar17 = (uVar223 != 0) * (uVar223 < 0x100) * cVar10 - (0xff < uVar223);
  cVar12 = (uVar225 != 0) * (uVar225 < 0x100) * cVar12 - (0xff < uVar225);
  uVar188 = CONCAT13(cVar12,CONCAT12((uVar224 != 0) * (uVar224 < 0x100) * cVar11 - (0xff < uVar224),
                                     CONCAT11(bVar17,(uVar206 != 0) * (uVar206 < 0x100) * bVar9 -
                                                     (0xff < uVar206))));
  cVar14 = (uVar227 != 0) * (uVar227 < 0x100) * cVar14 - (0xff < uVar227);
  uVar189 = CONCAT15(cVar14,CONCAT14((uVar226 != 0) * (uVar226 < 0x100) * cVar13 - (0xff < uVar226),
                                     uVar188));
  cVar16 = (uVar229 != 0) * (uVar229 < 0x100) * cVar16 - (0xff < uVar229);
  uVar191 = CONCAT17(cVar16,CONCAT16((uVar228 != 0) * (uVar228 < 0x100) * cVar15 - (0xff < uVar228),
                                     uVar189));
  cVar15 = (uVar348 != 0) * (uVar348 < 0x100) * cVar34 - (0xff < uVar348);
  auVar193._0_10_ =
       CONCAT19(cVar15,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar33 - (0xff < uVar343),
                                uVar191));
  auVar193[10] = (uVar349 != 0) * (uVar349 < 0x100) * cVar35 - (0xff < uVar349);
  cVar13 = (uVar350 != 0) * (uVar350 < 0x100) * cVar36 - (0xff < uVar350);
  auVar193[0xb] = cVar13;
  auVar197[0xc] = (uVar351 != 0) * (uVar351 < 0x100) * cVar37 - (0xff < uVar351);
  auVar197._0_12_ = auVar193;
  cVar11 = (uVar352 != 0) * (uVar352 < 0x100) * cVar38 - (0xff < uVar352);
  auVar197[0xd] = cVar11;
  auVar203[0xe] = (uVar353 != 0) * (uVar353 < 0x100) * cVar39 - (0xff < uVar353);
  auVar203._0_14_ = auVar197;
  cVar10 = (uVar354 != 0) * (uVar354 < 0x100) * cVar40 - (0xff < uVar354);
  auVar203[0xf] = cVar10;
  uVar206 = (ushort)bVar1;
  uVar223 = (ushort)((uint)uVar260 >> 0x18);
  uVar224 = (ushort)((uint6)uVar261 >> 0x28);
  uVar225 = (ushort)((ulong)uVar262 >> 0x38);
  uVar226 = (ushort)((unkuint10)auVar335._0_10_ >> 0x48);
  uVar227 = auVar335._10_2_ >> 8;
  uVar228 = auVar337._12_2_ >> 8;
  uVar229 = auVar341._14_2_ >> 8;
  uVar343 = (ushort)bVar25;
  uVar348 = (ushort)((uint)uVar299 >> 0x18);
  uVar349 = (ushort)((uint6)uVar300 >> 0x28);
  uVar350 = (ushort)((ulong)uVar301 >> 0x38);
  uVar351 = (ushort)((unkuint10)auVar344._0_10_ >> 0x48);
  uVar352 = auVar344._10_2_ >> 8;
  uVar353 = auVar345._12_2_ >> 8;
  uVar354 = auVar347._14_2_ >> 8;
  bVar9 = (uVar223 != 0) * (uVar223 < 0x100) * cVar2 - (0xff < uVar223);
  cVar23 = (uVar225 != 0) * (uVar225 < 0x100) * cVar4 - (0xff < uVar225);
  uVar309 = CONCAT13(cVar23,CONCAT12((uVar224 != 0) * (uVar224 < 0x100) * cVar3 - (0xff < uVar224),
                                     CONCAT11(bVar9,(uVar206 != 0) * (uVar206 < 0x100) * bVar1 -
                                                    (0xff < uVar206))));
  cVar2 = (uVar227 != 0) * (uVar227 < 0x100) * cVar6 - (0xff < uVar227);
  uVar310 = CONCAT15(cVar2,CONCAT14((uVar226 != 0) * (uVar226 < 0x100) * cVar5 - (0xff < uVar226),
                                    uVar309));
  cVar8 = (uVar229 != 0) * (uVar229 < 0x100) * cVar8 - (0xff < uVar229);
  uVar190 = CONCAT17(cVar8,CONCAT16((uVar228 != 0) * (uVar228 < 0x100) * cVar7 - (0xff < uVar228),
                                    uVar310));
  cVar6 = (uVar348 != 0) * (uVar348 < 0x100) * cVar26 - (0xff < uVar348);
  auVar336._0_10_ =
       CONCAT19(cVar6,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar25 - (0xff < uVar343),
                               uVar190));
  auVar336[10] = (uVar349 != 0) * (uVar349 < 0x100) * cVar27 - (0xff < uVar349);
  cVar5 = (uVar350 != 0) * (uVar350 < 0x100) * cVar28 - (0xff < uVar350);
  auVar336[0xb] = cVar5;
  auVar338[0xc] = (uVar351 != 0) * (uVar351 < 0x100) * cVar29 - (0xff < uVar351);
  auVar338._0_12_ = auVar336;
  cVar4 = (uVar352 != 0) * (uVar352 < 0x100) * cVar30 - (0xff < uVar352);
  auVar338[0xd] = cVar4;
  auVar342[0xe] = (uVar353 != 0) * (uVar353 < 0x100) * cVar31 - (0xff < uVar353);
  auVar342._0_14_ = auVar338;
  cVar3 = (uVar354 != 0) * (uVar354 < 0x100) * cVar32 - (0xff < uVar354);
  auVar342[0xf] = cVar3;
  auVar218 = auVar289 & _DAT_001b6830;
  auVar200 = auVar316 & _DAT_001b6830;
  sVar76 = auVar218._0_2_;
  sVar77 = auVar218._2_2_;
  bVar1 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[2] - (0xff < sVar77);
  sVar77 = auVar218._4_2_;
  sVar84 = auVar218._6_2_;
  cVar7 = (0 < sVar84) * (sVar84 < 0x100) * auVar218[6] - (0xff < sVar84);
  uVar299 = CONCAT13(cVar7,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar218[4] - (0xff < sVar77),
                                    CONCAT11(bVar1,(0 < sVar76) * (sVar76 < 0x100) * auVar218[0] -
                                                   (0xff < sVar76))));
  sVar76 = auVar218._8_2_;
  sVar77 = auVar218._10_2_;
  cVar24 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[10] - (0xff < sVar77);
  uVar300 = CONCAT15(cVar24,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar218[8] - (0xff < sVar76)
                                     ,uVar299));
  sVar76 = auVar218._12_2_;
  sVar77 = auVar218._14_2_;
  cVar31 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[0xe] - (0xff < sVar77);
  uVar301 = CONCAT17(cVar31,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar218[0xc] -
                                     (0xff < sVar76),uVar300));
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  cVar32 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  auVar302._0_10_ =
       CONCAT19(cVar32,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar200[0] - (0xff < sVar76),
                                uVar301));
  sVar76 = auVar200._4_2_;
  auVar302[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[4] - (0xff < sVar76);
  sVar76 = auVar200._6_2_;
  cVar30 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[6] - (0xff < sVar76);
  auVar302[0xb] = cVar30;
  sVar76 = auVar200._8_2_;
  auVar304[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76);
  auVar304._0_12_ = auVar302;
  sVar76 = auVar200._10_2_;
  cVar28 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[10] - (0xff < sVar76);
  auVar304[0xd] = cVar28;
  sVar76 = auVar200._12_2_;
  auVar307[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] - (0xff < sVar76);
  auVar307._0_14_ = auVar304;
  sVar76 = auVar200._14_2_;
  cVar26 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xe] - (0xff < sVar76);
  auVar307[0xf] = cVar26;
  auVar218 = auVar256 & _DAT_001b6830;
  auVar200 = auVar220 & _DAT_001b6830;
  sVar76 = auVar218._0_2_;
  sVar77 = auVar218._2_2_;
  bVar25 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[2] - (0xff < sVar77);
  sVar77 = auVar218._4_2_;
  sVar84 = auVar218._6_2_;
  cVar38 = (0 < sVar84) * (sVar84 < 0x100) * auVar218[6] - (0xff < sVar84);
  uVar319 = CONCAT13(cVar38,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar218[4] - (0xff < sVar77)
                                     ,CONCAT11(bVar25,(0 < sVar76) * (sVar76 < 0x100) * auVar218[0]
                                                      - (0xff < sVar76))));
  sVar76 = auVar218._8_2_;
  sVar77 = auVar218._10_2_;
  cVar37 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[10] - (0xff < sVar77);
  uVar320 = CONCAT15(cVar37,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar218[8] - (0xff < sVar76)
                                     ,uVar319));
  sVar76 = auVar218._12_2_;
  sVar77 = auVar218._14_2_;
  cVar36 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[0xe] - (0xff < sVar77);
  uVar321 = CONCAT17(cVar36,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar218[0xc] -
                                     (0xff < sVar76),uVar320));
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  cVar35 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  auVar322._0_10_ =
       CONCAT19(cVar35,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar200[0] - (0xff < sVar76),
                                uVar321));
  sVar76 = auVar200._4_2_;
  auVar322[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[4] - (0xff < sVar76);
  sVar76 = auVar200._6_2_;
  cVar27 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[6] - (0xff < sVar76);
  auVar322[0xb] = cVar27;
  sVar76 = auVar200._8_2_;
  auVar324[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76);
  auVar324._0_12_ = auVar322;
  sVar76 = auVar200._10_2_;
  cVar34 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[10] - (0xff < sVar76);
  auVar324[0xd] = cVar34;
  sVar76 = auVar200._12_2_;
  auVar326[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] - (0xff < sVar76);
  auVar326._0_14_ = auVar324;
  sVar76 = auVar200._14_2_;
  cVar29 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xe] - (0xff < sVar76);
  auVar326[0xf] = cVar29;
  auVar218 = auVar203 & _DAT_001b6830;
  auVar200 = auVar342 & _DAT_001b6830;
  sVar76 = auVar218._0_2_;
  sVar77 = auVar218._2_2_;
  bVar33 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[2] - (0xff < sVar77);
  sVar77 = auVar218._4_2_;
  sVar84 = auVar218._6_2_;
  cVar39 = (0 < sVar84) * (sVar84 < 0x100) * auVar218[6] - (0xff < sVar84);
  uVar260 = CONCAT13(cVar39,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar218[4] - (0xff < sVar77)
                                     ,CONCAT11(bVar33,(0 < sVar76) * (sVar76 < 0x100) * auVar218[0]
                                                      - (0xff < sVar76))));
  sVar76 = auVar218._8_2_;
  sVar77 = auVar218._10_2_;
  cVar40 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[10] - (0xff < sVar77);
  uVar261 = CONCAT15(cVar40,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar218[8] - (0xff < sVar76)
                                     ,uVar260));
  sVar76 = auVar218._12_2_;
  sVar77 = auVar218._14_2_;
  cVar45 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[0xe] - (0xff < sVar77);
  uVar262 = CONCAT17(cVar45,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar218[0xc] -
                                     (0xff < sVar76),uVar261));
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  cVar48 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  auVar263._0_10_ =
       CONCAT19(cVar48,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar200[0] - (0xff < sVar76),
                                uVar262));
  sVar76 = auVar200._4_2_;
  auVar263[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[4] - (0xff < sVar76);
  sVar76 = auVar200._6_2_;
  cVar47 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[6] - (0xff < sVar76);
  auVar263[0xb] = cVar47;
  sVar76 = auVar200._8_2_;
  auVar266[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76);
  auVar266._0_12_ = auVar263;
  sVar76 = auVar200._10_2_;
  cVar46 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[10] - (0xff < sVar76);
  auVar266[0xd] = cVar46;
  sVar76 = auVar200._12_2_;
  auVar269[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] - (0xff < sVar76);
  auVar269._0_14_ = auVar266;
  sVar76 = auVar200._14_2_;
  cVar44 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xe] - (0xff < sVar76);
  auVar269[0xf] = cVar44;
  uVar206 = (ushort)bVar49;
  uVar223 = (ushort)((uint)uVar247 >> 0x18);
  uVar224 = (ushort)((uint6)uVar248 >> 0x28);
  uVar225 = (ushort)((ulong)uVar282 >> 0x38);
  uVar226 = (ushort)((unkuint10)auVar283._0_10_ >> 0x48);
  uVar227 = auVar283._10_2_ >> 8;
  uVar228 = auVar286._12_2_ >> 8;
  uVar229 = auVar289._14_2_ >> 8;
  uVar343 = (ushort)bVar57;
  uVar348 = (ushort)((uint)uVar280 >> 0x18);
  uVar349 = (ushort)((uint6)uVar281 >> 0x28);
  uVar350 = (ushort)((ulong)uVar311 >> 0x38);
  uVar351 = (ushort)((unkuint10)auVar312._0_10_ >> 0x48);
  uVar352 = auVar312._10_2_ >> 8;
  uVar353 = auVar314._12_2_ >> 8;
  uVar354 = auVar316._14_2_ >> 8;
  bVar41 = (uVar223 != 0) * (uVar223 < 0x100) * cVar50 - (0xff < uVar223);
  cVar43 = (uVar225 != 0) * (uVar225 < 0x100) * cVar52 - (0xff < uVar225);
  uVar280 = CONCAT13(cVar43,CONCAT12((uVar224 != 0) * (uVar224 < 0x100) * cVar51 - (0xff < uVar224),
                                     CONCAT11(bVar41,(uVar206 != 0) * (uVar206 < 0x100) * bVar49 -
                                                     (0xff < uVar206))));
  cVar54 = (uVar227 != 0) * (uVar227 < 0x100) * cVar54 - (0xff < uVar227);
  uVar281 = CONCAT15(cVar54,CONCAT14((uVar226 != 0) * (uVar226 < 0x100) * cVar53 - (0xff < uVar226),
                                     uVar280));
  cVar52 = (uVar229 != 0) * (uVar229 < 0x100) * cVar56 - (0xff < uVar229);
  uVar282 = CONCAT17(cVar52,CONCAT16((uVar228 != 0) * (uVar228 < 0x100) * cVar55 - (0xff < uVar228),
                                     uVar281));
  cVar53 = (uVar348 != 0) * (uVar348 < 0x100) * cVar58 - (0xff < uVar348);
  auVar284._0_10_ =
       CONCAT19(cVar53,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar57 - (0xff < uVar343),
                                uVar282));
  auVar284[10] = (uVar349 != 0) * (uVar349 < 0x100) * cVar59 - (0xff < uVar349);
  cVar51 = (uVar350 != 0) * (uVar350 < 0x100) * cVar60 - (0xff < uVar350);
  auVar284[0xb] = cVar51;
  auVar287[0xc] = (uVar351 != 0) * (uVar351 < 0x100) * cVar61 - (0xff < uVar351);
  auVar287._0_12_ = auVar284;
  cVar50 = (uVar352 != 0) * (uVar352 < 0x100) * cVar62 - (0xff < uVar352);
  auVar287[0xd] = cVar50;
  auVar290[0xe] = (uVar353 != 0) * (uVar353 < 0x100) * cVar63 - (0xff < uVar353);
  auVar290._0_14_ = auVar287;
  cVar42 = (uVar354 != 0) * (uVar354 < 0x100) * cVar64 - (0xff < uVar354);
  auVar290[0xf] = cVar42;
  uVar343 = (ushort)bVar65;
  uVar348 = (ushort)((uint)uVar231 >> 0x18);
  uVar349 = (ushort)((uint6)uVar232 >> 0x28);
  uVar350 = (ushort)((ulong)uVar249 >> 0x38);
  uVar351 = (ushort)((unkuint10)auVar250._0_10_ >> 0x48);
  uVar352 = auVar250._10_2_ >> 8;
  uVar353 = auVar253._12_2_ >> 8;
  uVar354 = auVar256._14_2_ >> 8;
  uVar206 = (ushort)bVar73;
  uVar223 = (ushort)((uint)uVar207 >> 0x18);
  uVar224 = (ushort)((uint6)uVar208 >> 0x28);
  uVar225 = (ushort)((ulong)uVar209 >> 0x38);
  uVar226 = (ushort)((unkuint10)auVar211._0_10_ >> 0x48);
  uVar227 = auVar211._10_2_ >> 8;
  uVar228 = auVar215._12_2_ >> 8;
  uVar229 = auVar220._14_2_ >> 8;
  bVar49 = (uVar348 != 0) * (uVar348 < 0x100) * cVar66 - (0xff < uVar348);
  cVar55 = (uVar350 != 0) * (uVar350 < 0x100) * cVar68 - (0xff < uVar350);
  uVar247 = CONCAT13(cVar55,CONCAT12((uVar349 != 0) * (uVar349 < 0x100) * cVar67 - (0xff < uVar349),
                                     CONCAT11(bVar49,(uVar343 != 0) * (uVar343 < 0x100) * bVar65 -
                                                     (0xff < uVar343))));
  cVar56 = (uVar352 != 0) * (uVar352 < 0x100) * cVar70 - (0xff < uVar352);
  uVar248 = CONCAT15(cVar56,CONCAT14((uVar351 != 0) * (uVar351 < 0x100) * cVar69 - (0xff < uVar351),
                                     uVar247));
  cVar63 = (uVar354 != 0) * (uVar354 < 0x100) * cVar72 - (0xff < uVar354);
  uVar249 = CONCAT17(cVar63,CONCAT16((uVar353 != 0) * (uVar353 < 0x100) * cVar71 - (0xff < uVar353),
                                     uVar248));
  cVar64 = (uVar223 != 0) * (uVar223 < 0x100) * cVar74 - (0xff < uVar223);
  auVar251._0_10_ =
       CONCAT19(cVar64,CONCAT18((uVar206 != 0) * (uVar206 < 0x100) * bVar73 - (0xff < uVar206),
                                uVar249));
  auVar251[10] = (uVar224 != 0) * (uVar224 < 0x100) * cVar75 - (0xff < uVar224);
  cVar22 = (uVar225 != 0) * (uVar225 < 0x100) * cVar22 - (0xff < uVar225);
  auVar251[0xb] = cVar22;
  auVar254[0xc] = (uVar226 != 0) * (uVar226 < 0x100) * cVar21 - (0xff < uVar226);
  auVar254._0_12_ = auVar251;
  cVar20 = (uVar227 != 0) * (uVar227 < 0x100) * cVar20 - (0xff < uVar227);
  auVar254[0xd] = cVar20;
  auVar257[0xe] = (uVar228 != 0) * (uVar228 < 0x100) * cVar18 - (0xff < uVar228);
  auVar257._0_14_ = auVar254;
  cVar18 = (uVar229 != 0) * (uVar229 < 0x100) * cVar19 - (0xff < uVar229);
  auVar257[0xf] = cVar18;
  uVar206 = (ushort)bVar17;
  uVar223 = (ushort)((uint)uVar188 >> 0x18);
  uVar224 = (ushort)((uint6)uVar189 >> 0x28);
  uVar225 = (ushort)((ulong)uVar191 >> 0x38);
  uVar226 = (ushort)((unkuint10)auVar193._0_10_ >> 0x48);
  uVar227 = auVar193._10_2_ >> 8;
  uVar228 = auVar197._12_2_ >> 8;
  uVar229 = auVar203._14_2_ >> 8;
  uVar343 = (ushort)bVar9;
  uVar348 = (ushort)((uint)uVar309 >> 0x18);
  uVar349 = (ushort)((uint6)uVar310 >> 0x28);
  uVar350 = (ushort)((ulong)uVar190 >> 0x38);
  uVar351 = (ushort)((unkuint10)auVar336._0_10_ >> 0x48);
  uVar352 = auVar336._10_2_ >> 8;
  uVar353 = auVar338._12_2_ >> 8;
  uVar354 = auVar342._14_2_ >> 8;
  bVar57 = (uVar223 != 0) * (uVar223 < 0x100) * cVar12 - (0xff < uVar223);
  cVar12 = (uVar225 != 0) * (uVar225 < 0x100) * cVar16 - (0xff < uVar225);
  uVar188 = CONCAT13(cVar12,CONCAT12((uVar224 != 0) * (uVar224 < 0x100) * cVar14 - (0xff < uVar224),
                                     CONCAT11(bVar57,(uVar206 != 0) * (uVar206 < 0x100) * bVar17 -
                                                     (0xff < uVar206))));
  cVar14 = (uVar227 != 0) * (uVar227 < 0x100) * cVar13 - (0xff < uVar227);
  uVar189 = CONCAT15(cVar14,CONCAT14((uVar226 != 0) * (uVar226 < 0x100) * cVar15 - (0xff < uVar226),
                                     uVar188));
  cVar16 = (uVar229 != 0) * (uVar229 < 0x100) * cVar10 - (0xff < uVar229);
  uVar191 = CONCAT17(cVar16,CONCAT16((uVar228 != 0) * (uVar228 < 0x100) * cVar11 - (0xff < uVar228),
                                     uVar189));
  cVar15 = (uVar348 != 0) * (uVar348 < 0x100) * cVar23 - (0xff < uVar348);
  auVar194._0_10_ =
       CONCAT19(cVar15,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar9 - (0xff < uVar343),
                                uVar191));
  auVar194[10] = (uVar349 != 0) * (uVar349 < 0x100) * cVar2 - (0xff < uVar349);
  cVar8 = (uVar350 != 0) * (uVar350 < 0x100) * cVar8 - (0xff < uVar350);
  auVar194[0xb] = cVar8;
  auVar198[0xc] = (uVar351 != 0) * (uVar351 < 0x100) * cVar6 - (0xff < uVar351);
  auVar198._0_12_ = auVar194;
  cVar5 = (uVar352 != 0) * (uVar352 < 0x100) * cVar5 - (0xff < uVar352);
  auVar198[0xd] = cVar5;
  auVar204[0xe] = (uVar353 != 0) * (uVar353 < 0x100) * cVar4 - (0xff < uVar353);
  auVar204._0_14_ = auVar198;
  cVar3 = (uVar354 != 0) * (uVar354 < 0x100) * cVar3 - (0xff < uVar354);
  auVar204[0xf] = cVar3;
  auVar200 = auVar307 & _DAT_001b6830;
  auVar218 = auVar326 & _DAT_001b6830;
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  bVar9 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  sVar77 = auVar200._4_2_;
  sVar84 = auVar200._6_2_;
  cVar4 = (0 < sVar84) * (sVar84 < 0x100) * auVar200[6] - (0xff < sVar84);
  uVar207 = CONCAT13(cVar4,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar200[4] - (0xff < sVar77),
                                    CONCAT11(bVar9,(0 < sVar76) * (sVar76 < 0x100) * auVar200[0] -
                                                   (0xff < sVar76))));
  sVar76 = auVar200._8_2_;
  sVar77 = auVar200._10_2_;
  cVar6 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[10] - (0xff < sVar77);
  uVar208 = CONCAT15(cVar6,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76),
                                    uVar207));
  sVar76 = auVar200._12_2_;
  sVar77 = auVar200._14_2_;
  cVar2 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[0xe] - (0xff < sVar77);
  uVar190 = CONCAT17(cVar2,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] -
                                    (0xff < sVar76),uVar208));
  sVar76 = auVar218._0_2_;
  sVar77 = auVar218._2_2_;
  cVar13 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[2] - (0xff < sVar77);
  auVar212._0_10_ =
       CONCAT19(cVar13,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar218[0] - (0xff < sVar76),
                                uVar190));
  sVar76 = auVar218._4_2_;
  auVar212[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar218[4] - (0xff < sVar76);
  sVar76 = auVar218._6_2_;
  cVar11 = (0 < sVar76) * (sVar76 < 0x100) * auVar218[6] - (0xff < sVar76);
  auVar212[0xb] = cVar11;
  sVar76 = auVar218._8_2_;
  auVar216[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar218[8] - (0xff < sVar76);
  auVar216._0_12_ = auVar212;
  sVar76 = auVar218._10_2_;
  cVar10 = (0 < sVar76) * (sVar76 < 0x100) * auVar218[10] - (0xff < sVar76);
  auVar216[0xd] = cVar10;
  sVar76 = auVar218._12_2_;
  auVar221[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar218[0xc] - (0xff < sVar76);
  auVar221._0_14_ = auVar216;
  sVar76 = auVar218._14_2_;
  cVar19 = (0 < sVar76) * (sVar76 < 0x100) * auVar218[0xe] - (0xff < sVar76);
  auVar221[0xf] = cVar19;
  auVar218 = auVar269 & _DAT_001b6830;
  auVar200 = auVar290 & _DAT_001b6830;
  sVar76 = auVar218._0_2_;
  sVar77 = auVar218._2_2_;
  bVar17 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[2] - (0xff < sVar77);
  sVar77 = auVar218._4_2_;
  sVar84 = auVar218._6_2_;
  cVar21 = (0 < sVar84) * (sVar84 < 0x100) * auVar218[6] - (0xff < sVar84);
  uVar309 = CONCAT13(cVar21,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar218[4] - (0xff < sVar77)
                                     ,CONCAT11(bVar17,(0 < sVar76) * (sVar76 < 0x100) * auVar218[0]
                                                      - (0xff < sVar76))));
  sVar76 = auVar218._8_2_;
  sVar77 = auVar218._10_2_;
  cVar59 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[10] - (0xff < sVar77);
  uVar310 = CONCAT15(cVar59,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar218[8] - (0xff < sVar76)
                                     ,uVar309));
  sVar76 = auVar218._12_2_;
  sVar77 = auVar218._14_2_;
  cVar61 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[0xe] - (0xff < sVar77);
  uVar311 = CONCAT17(cVar61,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar218[0xc] -
                                     (0xff < sVar76),uVar310));
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  cVar58 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  auVar313._0_10_ =
       CONCAT19(cVar58,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar200[0] - (0xff < sVar76),
                                uVar311));
  sVar76 = auVar200._4_2_;
  auVar313[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[4] - (0xff < sVar76);
  sVar76 = auVar200._6_2_;
  cVar60 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[6] - (0xff < sVar76);
  auVar313[0xb] = cVar60;
  sVar76 = auVar200._8_2_;
  auVar315[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76);
  auVar315._0_12_ = auVar313;
  sVar76 = auVar200._10_2_;
  cVar62 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[10] - (0xff < sVar76);
  auVar315[0xd] = cVar62;
  sVar76 = auVar200._12_2_;
  auVar317[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] - (0xff < sVar76);
  auVar317._0_14_ = auVar315;
  sVar76 = auVar200._14_2_;
  cVar23 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xe] - (0xff < sVar76);
  auVar317[0xf] = cVar23;
  auVar200 = auVar257 & _DAT_001b6830;
  auVar218 = auVar204 & _DAT_001b6830;
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  bVar65 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  sVar77 = auVar200._4_2_;
  sVar84 = auVar200._6_2_;
  cVar66 = (0 < sVar84) * (sVar84 < 0x100) * auVar200[6] - (0xff < sVar84);
  uVar231 = CONCAT13(cVar66,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar200[4] - (0xff < sVar77)
                                     ,CONCAT11(bVar65,(0 < sVar76) * (sVar76 < 0x100) * auVar200[0]
                                                      - (0xff < sVar76))));
  sVar76 = auVar200._8_2_;
  sVar77 = auVar200._10_2_;
  cVar67 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[10] - (0xff < sVar77);
  uVar232 = CONCAT15(cVar67,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76)
                                     ,uVar231));
  sVar76 = auVar200._12_2_;
  sVar77 = auVar200._14_2_;
  cVar68 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[0xe] - (0xff < sVar77);
  uVar209 = CONCAT17(cVar68,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] -
                                     (0xff < sVar76),uVar232));
  sVar76 = auVar218._0_2_;
  sVar77 = auVar218._2_2_;
  cVar69 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[2] - (0xff < sVar77);
  auVar233._0_10_ =
       CONCAT19(cVar69,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar218[0] - (0xff < sVar76),
                                uVar209));
  sVar76 = auVar218._4_2_;
  auVar233[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar218[4] - (0xff < sVar76);
  sVar76 = auVar218._6_2_;
  cVar70 = (0 < sVar76) * (sVar76 < 0x100) * auVar218[6] - (0xff < sVar76);
  auVar233[0xb] = cVar70;
  sVar76 = auVar218._8_2_;
  auVar235[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar218[8] - (0xff < sVar76);
  auVar235._0_12_ = auVar233;
  sVar76 = auVar218._10_2_;
  cVar71 = (0 < sVar76) * (sVar76 < 0x100) * auVar218[10] - (0xff < sVar76);
  auVar235[0xd] = cVar71;
  sVar76 = auVar218._12_2_;
  auVar237[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar218[0xc] - (0xff < sVar76);
  auVar237._0_14_ = auVar235;
  sVar76 = auVar218._14_2_;
  cVar72 = (0 < sVar76) * (sVar76 < 0x100) * auVar218[0xe] - (0xff < sVar76);
  auVar237[0xf] = cVar72;
  uVar206 = (ushort)bVar1;
  uVar223 = (ushort)((uint)uVar299 >> 0x18);
  uVar224 = (ushort)((uint6)uVar300 >> 0x28);
  uVar225 = (ushort)((ulong)uVar301 >> 0x38);
  uVar226 = (ushort)((unkuint10)auVar302._0_10_ >> 0x48);
  uVar227 = auVar302._10_2_ >> 8;
  uVar228 = auVar304._12_2_ >> 8;
  uVar229 = auVar307._14_2_ >> 8;
  uVar343 = (ushort)bVar25;
  uVar348 = (ushort)((uint)uVar319 >> 0x18);
  uVar349 = (ushort)((uint6)uVar320 >> 0x28);
  uVar350 = (ushort)((ulong)uVar321 >> 0x38);
  uVar351 = (ushort)((unkuint10)auVar322._0_10_ >> 0x48);
  uVar352 = auVar322._10_2_ >> 8;
  uVar353 = auVar324._12_2_ >> 8;
  uVar354 = auVar326._14_2_ >> 8;
  bVar73 = (uVar223 != 0) * (uVar223 < 0x100) * cVar7 - (0xff < uVar223);
  cVar7 = (uVar225 != 0) * (uVar225 < 0x100) * cVar31 - (0xff < uVar225);
  uVar299 = CONCAT13(cVar7,CONCAT12((uVar224 != 0) * (uVar224 < 0x100) * cVar24 - (0xff < uVar224),
                                    CONCAT11(bVar73,(uVar206 != 0) * (uVar206 < 0x100) * bVar1 -
                                                    (0xff < uVar206))));
  cVar75 = (uVar227 != 0) * (uVar227 < 0x100) * cVar30 - (0xff < uVar227);
  uVar300 = CONCAT15(cVar75,CONCAT14((uVar226 != 0) * (uVar226 < 0x100) * cVar32 - (0xff < uVar226),
                                     uVar299));
  cVar26 = (uVar229 != 0) * (uVar229 < 0x100) * cVar26 - (0xff < uVar229);
  uVar301 = CONCAT17(cVar26,CONCAT16((uVar228 != 0) * (uVar228 < 0x100) * cVar28 - (0xff < uVar228),
                                     uVar300));
  cVar30 = (uVar348 != 0) * (uVar348 < 0x100) * cVar38 - (0xff < uVar348);
  auVar303._0_10_ =
       CONCAT19(cVar30,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar25 - (0xff < uVar343),
                                uVar301));
  auVar303[10] = (uVar349 != 0) * (uVar349 < 0x100) * cVar37 - (0xff < uVar349);
  cVar32 = (uVar350 != 0) * (uVar350 < 0x100) * cVar36 - (0xff < uVar350);
  auVar303[0xb] = cVar32;
  auVar305[0xc] = (uVar351 != 0) * (uVar351 < 0x100) * cVar35 - (0xff < uVar351);
  auVar305._0_12_ = auVar303;
  cVar31 = (uVar352 != 0) * (uVar352 < 0x100) * cVar27 - (0xff < uVar352);
  auVar305[0xd] = cVar31;
  auVar308[0xe] = (uVar353 != 0) * (uVar353 < 0x100) * cVar34 - (0xff < uVar353);
  auVar308._0_14_ = auVar305;
  cVar24 = (uVar354 != 0) * (uVar354 < 0x100) * cVar29 - (0xff < uVar354);
  auVar308[0xf] = cVar24;
  uVar206 = (ushort)bVar33;
  uVar223 = (ushort)((uint)uVar260 >> 0x18);
  uVar224 = (ushort)((uint6)uVar261 >> 0x28);
  uVar225 = (ushort)((ulong)uVar262 >> 0x38);
  uVar226 = (ushort)((unkuint10)auVar263._0_10_ >> 0x48);
  uVar227 = auVar263._10_2_ >> 8;
  uVar228 = auVar266._12_2_ >> 8;
  uVar229 = auVar269._14_2_ >> 8;
  uVar343 = (ushort)bVar41;
  uVar348 = (ushort)((uint)uVar280 >> 0x18);
  uVar349 = (ushort)((uint6)uVar281 >> 0x28);
  uVar350 = (ushort)((ulong)uVar282 >> 0x38);
  uVar351 = (ushort)((unkuint10)auVar284._0_10_ >> 0x48);
  uVar352 = auVar284._10_2_ >> 8;
  uVar353 = auVar287._12_2_ >> 8;
  uVar354 = auVar290._14_2_ >> 8;
  bVar1 = (uVar223 != 0) * (uVar223 < 0x100) * cVar39 - (0xff < uVar223);
  cVar36 = (uVar225 != 0) * (uVar225 < 0x100) * cVar45 - (0xff < uVar225);
  uVar260 = CONCAT13(cVar36,CONCAT12((uVar224 != 0) * (uVar224 < 0x100) * cVar40 - (0xff < uVar224),
                                     CONCAT11(bVar1,(uVar206 != 0) * (uVar206 < 0x100) * bVar33 -
                                                    (0xff < uVar206))));
  cVar35 = (uVar227 != 0) * (uVar227 < 0x100) * cVar47 - (0xff < uVar227);
  uVar261 = CONCAT15(cVar35,CONCAT14((uVar226 != 0) * (uVar226 < 0x100) * cVar48 - (0xff < uVar226),
                                     uVar260));
  cVar34 = (uVar229 != 0) * (uVar229 < 0x100) * cVar44 - (0xff < uVar229);
  uVar262 = CONCAT17(cVar34,CONCAT16((uVar228 != 0) * (uVar228 < 0x100) * cVar46 - (0xff < uVar228),
                                     uVar261));
  cVar37 = (uVar348 != 0) * (uVar348 < 0x100) * cVar43 - (0xff < uVar348);
  auVar264._0_10_ =
       CONCAT19(cVar37,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar41 - (0xff < uVar343),
                                uVar262));
  auVar264[10] = (uVar349 != 0) * (uVar349 < 0x100) * cVar54 - (0xff < uVar349);
  cVar29 = (uVar350 != 0) * (uVar350 < 0x100) * cVar52 - (0xff < uVar350);
  auVar264[0xb] = cVar29;
  auVar267[0xc] = (uVar351 != 0) * (uVar351 < 0x100) * cVar53 - (0xff < uVar351);
  auVar267._0_12_ = auVar264;
  cVar27 = (uVar352 != 0) * (uVar352 < 0x100) * cVar51 - (0xff < uVar352);
  auVar267[0xd] = cVar27;
  auVar270[0xe] = (uVar353 != 0) * (uVar353 < 0x100) * cVar50 - (0xff < uVar353);
  auVar270._0_14_ = auVar267;
  cVar28 = (uVar354 != 0) * (uVar354 < 0x100) * cVar42 - (0xff < uVar354);
  auVar270[0xf] = cVar28;
  uVar343 = (ushort)bVar49;
  uVar348 = (ushort)((uint)uVar247 >> 0x18);
  uVar349 = (ushort)((uint6)uVar248 >> 0x28);
  uVar350 = (ushort)((ulong)uVar249 >> 0x38);
  uVar351 = (ushort)((unkuint10)auVar251._0_10_ >> 0x48);
  uVar352 = auVar251._10_2_ >> 8;
  uVar353 = auVar254._12_2_ >> 8;
  uVar354 = auVar257._14_2_ >> 8;
  uVar206 = (ushort)bVar57;
  uVar223 = (ushort)((uint)uVar188 >> 0x18);
  uVar224 = (ushort)((uint6)uVar189 >> 0x28);
  uVar225 = (ushort)((ulong)uVar191 >> 0x38);
  uVar226 = (ushort)((unkuint10)auVar194._0_10_ >> 0x48);
  uVar227 = auVar194._10_2_ >> 8;
  uVar228 = auVar198._12_2_ >> 8;
  uVar229 = auVar204._14_2_ >> 8;
  bVar25 = (uVar348 != 0) * (uVar348 < 0x100) * cVar55 - (0xff < uVar348);
  cVar38 = (uVar350 != 0) * (uVar350 < 0x100) * cVar63 - (0xff < uVar350);
  uVar247 = CONCAT13(cVar38,CONCAT12((uVar349 != 0) * (uVar349 < 0x100) * cVar56 - (0xff < uVar349),
                                     CONCAT11(bVar25,(uVar343 != 0) * (uVar343 < 0x100) * bVar49 -
                                                     (0xff < uVar343))));
  cVar22 = (uVar352 != 0) * (uVar352 < 0x100) * cVar22 - (0xff < uVar352);
  uVar248 = CONCAT15(cVar22,CONCAT14((uVar351 != 0) * (uVar351 < 0x100) * cVar64 - (0xff < uVar351),
                                     uVar247));
  cVar18 = (uVar354 != 0) * (uVar354 < 0x100) * cVar18 - (0xff < uVar354);
  uVar249 = CONCAT17(cVar18,CONCAT16((uVar353 != 0) * (uVar353 < 0x100) * cVar20 - (0xff < uVar353),
                                     uVar248));
  cVar12 = (uVar223 != 0) * (uVar223 < 0x100) * cVar12 - (0xff < uVar223);
  auVar252._0_10_ =
       CONCAT19(cVar12,CONCAT18((uVar206 != 0) * (uVar206 < 0x100) * bVar57 - (0xff < uVar206),
                                uVar249));
  auVar252[10] = (uVar224 != 0) * (uVar224 < 0x100) * cVar14 - (0xff < uVar224);
  cVar16 = (uVar225 != 0) * (uVar225 < 0x100) * cVar16 - (0xff < uVar225);
  auVar252[0xb] = cVar16;
  auVar255[0xc] = (uVar226 != 0) * (uVar226 < 0x100) * cVar15 - (0xff < uVar226);
  auVar255._0_12_ = auVar252;
  cVar8 = (uVar227 != 0) * (uVar227 < 0x100) * cVar8 - (0xff < uVar227);
  auVar255[0xd] = cVar8;
  auVar258[0xe] = (uVar228 != 0) * (uVar228 < 0x100) * cVar5 - (0xff < uVar228);
  auVar258._0_14_ = auVar255;
  cVar3 = (uVar229 != 0) * (uVar229 < 0x100) * cVar3 - (0xff < uVar229);
  auVar258[0xf] = cVar3;
  auVar200 = auVar221 & _DAT_001b6830;
  auVar218 = auVar317 & _DAT_001b6830;
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  bVar33 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  sVar77 = auVar200._4_2_;
  sVar84 = auVar200._6_2_;
  cVar45 = (0 < sVar84) * (sVar84 < 0x100) * auVar200[6] - (0xff < sVar84);
  uVar188 = CONCAT13(cVar45,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar200[4] - (0xff < sVar77)
                                     ,CONCAT11(bVar33,(0 < sVar76) * (sVar76 < 0x100) * auVar200[0]
                                                      - (0xff < sVar76))));
  sVar76 = auVar200._8_2_;
  sVar77 = auVar200._10_2_;
  cVar40 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[10] - (0xff < sVar77);
  uVar189 = CONCAT15(cVar40,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76)
                                     ,uVar188));
  sVar76 = auVar200._12_2_;
  sVar77 = auVar200._14_2_;
  cVar39 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[0xe] - (0xff < sVar77);
  uVar191 = CONCAT17(cVar39,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] -
                                     (0xff < sVar76),uVar189));
  sVar76 = auVar218._0_2_;
  sVar77 = auVar218._2_2_;
  cVar5 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[2] - (0xff < sVar77);
  auVar195._0_10_ =
       CONCAT19(cVar5,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar218[0] - (0xff < sVar76),
                               uVar191));
  sVar76 = auVar218._4_2_;
  auVar195[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar218[4] - (0xff < sVar76);
  sVar76 = auVar218._6_2_;
  cVar20 = (0 < sVar76) * (sVar76 < 0x100) * auVar218[6] - (0xff < sVar76);
  auVar195[0xb] = cVar20;
  sVar76 = auVar218._8_2_;
  auVar199[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar218[8] - (0xff < sVar76);
  auVar199._0_12_ = auVar195;
  sVar76 = auVar218._10_2_;
  cVar14 = (0 < sVar76) * (sVar76 < 0x100) * auVar218[10] - (0xff < sVar76);
  auVar199[0xd] = cVar14;
  sVar76 = auVar218._12_2_;
  auVar205[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar218[0xc] - (0xff < sVar76);
  auVar205._0_14_ = auVar199;
  sVar76 = auVar218._14_2_;
  cVar15 = (0 < sVar76) * (sVar76 < 0x100) * auVar218[0xe] - (0xff < sVar76);
  auVar205[0xf] = cVar15;
  auVar218 = auVar237 & _DAT_001b6830;
  auVar200 = auVar308 & _DAT_001b6830;
  sVar76 = auVar218._0_2_;
  sVar77 = auVar218._2_2_;
  bVar41 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[2] - (0xff < sVar77);
  sVar77 = auVar218._4_2_;
  sVar84 = auVar218._6_2_;
  cVar48 = (0 < sVar84) * (sVar84 < 0x100) * auVar218[6] - (0xff < sVar84);
  uVar319 = CONCAT13(cVar48,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar218[4] - (0xff < sVar77)
                                     ,CONCAT11(bVar41,(0 < sVar76) * (sVar76 < 0x100) * auVar218[0]
                                                      - (0xff < sVar76))));
  sVar76 = auVar218._8_2_;
  sVar77 = auVar218._10_2_;
  cVar47 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[10] - (0xff < sVar77);
  uVar320 = CONCAT15(cVar47,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar218[8] - (0xff < sVar76)
                                     ,uVar319));
  sVar76 = auVar218._12_2_;
  sVar77 = auVar218._14_2_;
  cVar46 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[0xe] - (0xff < sVar77);
  uVar321 = CONCAT17(cVar46,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar218[0xc] -
                                     (0xff < sVar76),uVar320));
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  cVar44 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  auVar323._0_10_ =
       CONCAT19(cVar44,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar200[0] - (0xff < sVar76),
                                uVar321));
  sVar76 = auVar200._4_2_;
  auVar323[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[4] - (0xff < sVar76);
  sVar76 = auVar200._6_2_;
  cVar43 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[6] - (0xff < sVar76);
  auVar323[0xb] = cVar43;
  sVar76 = auVar200._8_2_;
  auVar325[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76);
  auVar325._0_12_ = auVar323;
  sVar76 = auVar200._10_2_;
  cVar42 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[10] - (0xff < sVar76);
  auVar325[0xd] = cVar42;
  sVar76 = auVar200._12_2_;
  auVar327[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] - (0xff < sVar76);
  auVar327._0_14_ = auVar325;
  sVar76 = auVar200._14_2_;
  cVar50 = (0 < sVar76) * (sVar76 < 0x100) * auVar200[0xe] - (0xff < sVar76);
  auVar327[0xf] = cVar50;
  auVar200 = auVar270 & _DAT_001b6830;
  auVar218 = auVar258 & _DAT_001b6830;
  sVar76 = auVar200._0_2_;
  sVar77 = auVar200._2_2_;
  bVar49 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[2] - (0xff < sVar77);
  sVar77 = auVar200._4_2_;
  sVar84 = auVar200._6_2_;
  cVar56 = (0 < sVar84) * (sVar84 < 0x100) * auVar200[6] - (0xff < sVar84);
  uVar280 = CONCAT13(cVar56,CONCAT12((0 < sVar77) * (sVar77 < 0x100) * auVar200[4] - (0xff < sVar77)
                                     ,CONCAT11(bVar49,(0 < sVar76) * (sVar76 < 0x100) * auVar200[0]
                                                      - (0xff < sVar76))));
  sVar76 = auVar200._8_2_;
  sVar77 = auVar200._10_2_;
  cVar51 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[10] - (0xff < sVar77);
  uVar281 = CONCAT15(cVar51,CONCAT14((0 < sVar76) * (sVar76 < 0x100) * auVar200[8] - (0xff < sVar76)
                                     ,uVar280));
  sVar76 = auVar200._12_2_;
  sVar77 = auVar200._14_2_;
  cVar55 = (0 < sVar77) * (sVar77 < 0x100) * auVar200[0xe] - (0xff < sVar77);
  uVar282 = CONCAT17(cVar55,CONCAT16((0 < sVar76) * (sVar76 < 0x100) * auVar200[0xc] -
                                     (0xff < sVar76),uVar281));
  sVar76 = auVar218._0_2_;
  sVar77 = auVar218._2_2_;
  cVar63 = (0 < sVar77) * (sVar77 < 0x100) * auVar218[2] - (0xff < sVar77);
  auVar285._0_10_ =
       CONCAT19(cVar63,CONCAT18((0 < sVar76) * (sVar76 < 0x100) * auVar218[0] - (0xff < sVar76),
                                uVar282));
  sVar76 = auVar218._4_2_;
  auVar285[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar218[4] - (0xff < sVar76);
  sVar76 = auVar218._6_2_;
  cVar54 = (0 < sVar76) * (sVar76 < 0x100) * auVar218[6] - (0xff < sVar76);
  auVar285[0xb] = cVar54;
  sVar76 = auVar218._8_2_;
  auVar288[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar218[8] - (0xff < sVar76);
  auVar288._0_12_ = auVar285;
  sVar76 = auVar218._10_2_;
  cVar53 = (0 < sVar76) * (sVar76 < 0x100) * auVar218[10] - (0xff < sVar76);
  auVar288[0xd] = cVar53;
  sVar76 = auVar218._12_2_;
  auVar291[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar218[0xc] - (0xff < sVar76);
  auVar291._0_14_ = auVar288;
  sVar76 = auVar218._14_2_;
  cVar52 = (0 < sVar76) * (sVar76 < 0x100) * auVar218[0xe] - (0xff < sVar76);
  auVar291[0xf] = cVar52;
  uVar206 = (ushort)bVar9;
  uVar223 = (ushort)((uint)uVar207 >> 0x18);
  uVar224 = (ushort)((uint6)uVar208 >> 0x28);
  uVar225 = (ushort)((ulong)uVar190 >> 0x38);
  uVar226 = (ushort)((unkuint10)auVar212._0_10_ >> 0x48);
  uVar227 = auVar212._10_2_ >> 8;
  uVar228 = auVar216._12_2_ >> 8;
  uVar229 = auVar221._14_2_ >> 8;
  uVar343 = (ushort)bVar17;
  uVar348 = (ushort)((uint)uVar309 >> 0x18);
  uVar349 = (ushort)((uint6)uVar310 >> 0x28);
  uVar350 = (ushort)((ulong)uVar311 >> 0x38);
  uVar351 = (ushort)((unkuint10)auVar313._0_10_ >> 0x48);
  uVar352 = auVar313._10_2_ >> 8;
  uVar353 = auVar315._12_2_ >> 8;
  uVar354 = auVar317._14_2_ >> 8;
  bVar57 = (uVar223 != 0) * (uVar223 < 0x100) * cVar4 - (0xff < uVar223);
  cVar4 = (uVar225 != 0) * (uVar225 < 0x100) * cVar2 - (0xff < uVar225);
  uVar207 = CONCAT13(cVar4,CONCAT12((uVar224 != 0) * (uVar224 < 0x100) * cVar6 - (0xff < uVar224),
                                    CONCAT11(bVar57,(uVar206 != 0) * (uVar206 < 0x100) * bVar9 -
                                                    (0xff < uVar206))));
  cVar6 = (uVar227 != 0) * (uVar227 < 0x100) * cVar11 - (0xff < uVar227);
  uVar208 = CONCAT15(cVar6,CONCAT14((uVar226 != 0) * (uVar226 < 0x100) * cVar13 - (0xff < uVar226),
                                    uVar207));
  cVar2 = (uVar229 != 0) * (uVar229 < 0x100) * cVar19 - (0xff < uVar229);
  uVar190 = CONCAT17(cVar2,CONCAT16((uVar228 != 0) * (uVar228 < 0x100) * cVar10 - (0xff < uVar228),
                                    uVar208));
  cVar13 = (uVar348 != 0) * (uVar348 < 0x100) * cVar21 - (0xff < uVar348);
  auVar213._0_10_ =
       CONCAT19(cVar13,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar17 - (0xff < uVar343),
                                uVar190));
  auVar213[10] = (uVar349 != 0) * (uVar349 < 0x100) * cVar59 - (0xff < uVar349);
  cVar11 = (uVar350 != 0) * (uVar350 < 0x100) * cVar61 - (0xff < uVar350);
  auVar213[0xb] = cVar11;
  auVar217[0xc] = (uVar351 != 0) * (uVar351 < 0x100) * cVar58 - (0xff < uVar351);
  auVar217._0_12_ = auVar213;
  cVar10 = (uVar352 != 0) * (uVar352 < 0x100) * cVar60 - (0xff < uVar352);
  auVar217[0xd] = cVar10;
  auVar222[0xe] = (uVar353 != 0) * (uVar353 < 0x100) * cVar62 - (0xff < uVar353);
  auVar222._0_14_ = auVar217;
  cVar19 = (uVar354 != 0) * (uVar354 < 0x100) * cVar23 - (0xff < uVar354);
  auVar222[0xf] = cVar19;
  uVar206 = (ushort)bVar65;
  uVar223 = (ushort)((uint)uVar231 >> 0x18);
  uVar224 = (ushort)((uint6)uVar232 >> 0x28);
  uVar225 = (ushort)((ulong)uVar209 >> 0x38);
  uVar226 = (ushort)((unkuint10)auVar233._0_10_ >> 0x48);
  uVar227 = auVar233._10_2_ >> 8;
  uVar228 = auVar235._12_2_ >> 8;
  uVar229 = auVar237._14_2_ >> 8;
  uVar343 = (ushort)bVar73;
  uVar348 = (ushort)((uint)uVar299 >> 0x18);
  uVar349 = (ushort)((uint6)uVar300 >> 0x28);
  uVar350 = (ushort)((ulong)uVar301 >> 0x38);
  uVar351 = (ushort)((unkuint10)auVar303._0_10_ >> 0x48);
  uVar352 = auVar303._10_2_ >> 8;
  uVar353 = auVar305._12_2_ >> 8;
  uVar354 = auVar308._14_2_ >> 8;
  bVar9 = (uVar223 != 0) * (uVar223 < 0x100) * cVar66 - (0xff < uVar223);
  cVar60 = (uVar225 != 0) * (uVar225 < 0x100) * cVar68 - (0xff < uVar225);
  uVar231 = CONCAT13(cVar60,CONCAT12((uVar224 != 0) * (uVar224 < 0x100) * cVar67 - (0xff < uVar224),
                                     CONCAT11(bVar9,(uVar206 != 0) * (uVar206 < 0x100) * bVar65 -
                                                    (0xff < uVar206))));
  cVar62 = (uVar227 != 0) * (uVar227 < 0x100) * cVar70 - (0xff < uVar227);
  uVar232 = CONCAT15(cVar62,CONCAT14((uVar226 != 0) * (uVar226 < 0x100) * cVar69 - (0xff < uVar226),
                                     uVar231));
  cVar21 = (uVar229 != 0) * (uVar229 < 0x100) * cVar72 - (0xff < uVar229);
  uVar209 = CONCAT17(cVar21,CONCAT16((uVar228 != 0) * (uVar228 < 0x100) * cVar71 - (0xff < uVar228),
                                     uVar232));
  cVar64 = (uVar348 != 0) * (uVar348 < 0x100) * cVar7 - (0xff < uVar348);
  auVar234._0_10_ =
       CONCAT19(cVar64,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar73 - (0xff < uVar343),
                                uVar209));
  auVar234[10] = (uVar349 != 0) * (uVar349 < 0x100) * cVar75 - (0xff < uVar349);
  cVar26 = (uVar350 != 0) * (uVar350 < 0x100) * cVar26 - (0xff < uVar350);
  auVar234[0xb] = cVar26;
  auVar236[0xc] = (uVar351 != 0) * (uVar351 < 0x100) * cVar30 - (0xff < uVar351);
  auVar236._0_12_ = auVar234;
  cVar23 = (uVar352 != 0) * (uVar352 < 0x100) * cVar32 - (0xff < uVar352);
  auVar236[0xd] = cVar23;
  auVar238[0xe] = (uVar353 != 0) * (uVar353 < 0x100) * cVar31 - (0xff < uVar353);
  auVar238._0_14_ = auVar236;
  cVar7 = (uVar354 != 0) * (uVar354 < 0x100) * cVar24 - (0xff < uVar354);
  auVar238[0xf] = cVar7;
  uVar343 = (ushort)bVar1;
  uVar348 = (ushort)((uint)uVar260 >> 0x18);
  uVar349 = (ushort)((uint6)uVar261 >> 0x28);
  uVar350 = (ushort)((ulong)uVar262 >> 0x38);
  uVar351 = (ushort)((unkuint10)auVar264._0_10_ >> 0x48);
  uVar352 = auVar264._10_2_ >> 8;
  uVar353 = auVar267._12_2_ >> 8;
  uVar354 = auVar270._14_2_ >> 8;
  uVar206 = (ushort)bVar25;
  uVar223 = (ushort)((uint)uVar247 >> 0x18);
  uVar224 = (ushort)((uint6)uVar248 >> 0x28);
  uVar225 = (ushort)((ulong)uVar249 >> 0x38);
  uVar226 = (ushort)((unkuint10)auVar252._0_10_ >> 0x48);
  uVar227 = auVar252._10_2_ >> 8;
  uVar228 = auVar255._12_2_ >> 8;
  uVar229 = auVar258._14_2_ >> 8;
  bVar17 = (uVar348 != 0) * (uVar348 < 0x100) * cVar36 - (0xff < uVar348);
  cVar24 = (uVar350 != 0) * (uVar350 < 0x100) * cVar34 - (0xff < uVar350);
  uVar247 = CONCAT13(cVar24,CONCAT12((uVar349 != 0) * (uVar349 < 0x100) * cVar35 - (0xff < uVar349),
                                     CONCAT11(bVar17,(uVar343 != 0) * (uVar343 < 0x100) * bVar1 -
                                                     (0xff < uVar343))));
  cVar31 = (uVar352 != 0) * (uVar352 < 0x100) * cVar29 - (0xff < uVar352);
  uVar248 = CONCAT15(cVar31,CONCAT14((uVar351 != 0) * (uVar351 < 0x100) * cVar37 - (0xff < uVar351),
                                     uVar247));
  cVar32 = (uVar354 != 0) * (uVar354 < 0x100) * cVar28 - (0xff < uVar354);
  uVar249 = CONCAT17(cVar32,CONCAT16((uVar353 != 0) * (uVar353 < 0x100) * cVar27 - (0xff < uVar353),
                                     uVar248));
  cVar30 = (uVar223 != 0) * (uVar223 < 0x100) * cVar38 - (0xff < uVar223);
  auVar265._0_10_ =
       CONCAT19(cVar30,CONCAT18((uVar206 != 0) * (uVar206 < 0x100) * bVar25 - (0xff < uVar206),
                                uVar249));
  auVar265[10] = (uVar224 != 0) * (uVar224 < 0x100) * cVar22 - (0xff < uVar224);
  cVar18 = (uVar225 != 0) * (uVar225 < 0x100) * cVar18 - (0xff < uVar225);
  auVar265[0xb] = cVar18;
  auVar268[0xc] = (uVar226 != 0) * (uVar226 < 0x100) * cVar12 - (0xff < uVar226);
  auVar268._0_12_ = auVar265;
  cVar16 = (uVar227 != 0) * (uVar227 < 0x100) * cVar16 - (0xff < uVar227);
  auVar268[0xd] = cVar16;
  auVar271[0xe] = (uVar228 != 0) * (uVar228 < 0x100) * cVar8 - (0xff < uVar228);
  auVar271._0_14_ = auVar268;
  cVar3 = (uVar229 != 0) * (uVar229 < 0x100) * cVar3 - (0xff < uVar229);
  auVar271[0xf] = cVar3;
  auVar218 = auVar205 & _DAT_001b6830;
  auVar306 = auVar327 & _DAT_001b6830;
  sVar76 = auVar218._0_2_;
  sVar78 = auVar218._2_2_;
  sVar81 = auVar218._4_2_;
  sVar85 = auVar218._6_2_;
  sVar88 = auVar218._8_2_;
  sVar91 = auVar218._10_2_;
  sVar94 = auVar218._12_2_;
  sVar97 = auVar218._14_2_;
  sVar100 = auVar306._0_2_;
  sVar103 = auVar306._2_2_;
  sVar106 = auVar306._4_2_;
  sVar109 = auVar306._6_2_;
  sVar112 = auVar306._8_2_;
  sVar115 = auVar306._10_2_;
  sVar118 = auVar306._12_2_;
  sVar121 = auVar306._14_2_;
  auVar339 = auVar291 & _DAT_001b6830;
  auVar365 = auVar222 & _DAT_001b6830;
  sVar77 = auVar339._0_2_;
  sVar79 = auVar339._2_2_;
  sVar82 = auVar339._4_2_;
  sVar86 = auVar339._6_2_;
  sVar89 = auVar339._8_2_;
  sVar92 = auVar339._10_2_;
  sVar95 = auVar339._12_2_;
  sVar98 = auVar339._14_2_;
  sVar101 = auVar365._0_2_;
  sVar104 = auVar365._2_2_;
  sVar107 = auVar365._4_2_;
  sVar110 = auVar365._6_2_;
  sVar113 = auVar365._8_2_;
  sVar116 = auVar365._10_2_;
  sVar119 = auVar365._12_2_;
  sVar122 = auVar365._14_2_;
  auVar364 = auVar238 & _DAT_001b6830;
  auVar200 = _DAT_001b6830 & auVar271;
  sVar84 = auVar364._0_2_;
  sVar80 = auVar364._2_2_;
  sVar83 = auVar364._4_2_;
  sVar87 = auVar364._6_2_;
  sVar90 = auVar364._8_2_;
  sVar93 = auVar364._10_2_;
  sVar96 = auVar364._12_2_;
  sVar99 = auVar364._14_2_;
  sVar102 = auVar200._0_2_;
  sVar105 = auVar200._2_2_;
  sVar108 = auVar200._4_2_;
  sVar111 = auVar200._6_2_;
  sVar114 = auVar200._8_2_;
  sVar117 = auVar200._10_2_;
  sVar120 = auVar200._12_2_;
  sVar123 = auVar200._14_2_;
  uVar206 = (ushort)bVar33;
  uVar223 = (ushort)((uint)uVar188 >> 0x18);
  uVar224 = (ushort)((uint6)uVar189 >> 0x28);
  uVar225 = (ushort)((ulong)uVar191 >> 0x38);
  uVar226 = (ushort)((unkuint10)auVar195._0_10_ >> 0x48);
  uVar227 = auVar195._10_2_ >> 8;
  uVar228 = auVar199._12_2_ >> 8;
  uVar229 = auVar205._14_2_ >> 8;
  uVar318 = (ushort)bVar41;
  uVar328 = (ushort)((uint)uVar319 >> 0x18);
  uVar329 = (ushort)((uint6)uVar320 >> 0x28);
  uVar330 = (ushort)((ulong)uVar321 >> 0x38);
  uVar331 = (ushort)((unkuint10)auVar323._0_10_ >> 0x48);
  uVar332 = auVar323._10_2_ >> 8;
  uVar333 = auVar325._12_2_ >> 8;
  uVar334 = auVar327._14_2_ >> 8;
  uVar279 = (ushort)bVar49;
  uVar292 = (ushort)((uint)uVar280 >> 0x18);
  uVar293 = (ushort)((uint6)uVar281 >> 0x28);
  uVar294 = (ushort)((ulong)uVar282 >> 0x38);
  uVar295 = (ushort)((unkuint10)auVar285._0_10_ >> 0x48);
  uVar296 = auVar285._10_2_ >> 8;
  uVar297 = auVar288._12_2_ >> 8;
  uVar298 = auVar291._14_2_ >> 8;
  uVar343 = (ushort)bVar57;
  uVar348 = (ushort)((uint)uVar207 >> 0x18);
  uVar349 = (ushort)((uint6)uVar208 >> 0x28);
  uVar350 = (ushort)((ulong)uVar190 >> 0x38);
  uVar351 = (ushort)((unkuint10)auVar213._0_10_ >> 0x48);
  uVar352 = auVar213._10_2_ >> 8;
  uVar353 = auVar217._12_2_ >> 8;
  uVar354 = auVar222._14_2_ >> 8;
  uVar230 = (ushort)bVar9;
  uVar239 = (ushort)((uint)uVar231 >> 0x18);
  uVar240 = (ushort)((uint6)uVar232 >> 0x28);
  uVar241 = (ushort)((ulong)uVar209 >> 0x38);
  uVar242 = (ushort)((unkuint10)auVar234._0_10_ >> 0x48);
  uVar243 = auVar234._10_2_ >> 8;
  uVar244 = auVar236._12_2_ >> 8;
  uVar245 = auVar238._14_2_ >> 8;
  uVar259 = (ushort)bVar17;
  uVar272 = (ushort)((uint)uVar247 >> 0x18);
  uVar273 = (ushort)((uint6)uVar248 >> 0x28);
  uVar274 = (ushort)((ulong)uVar249 >> 0x38);
  uVar275 = (ushort)((unkuint10)auVar265._0_10_ >> 0x48);
  uVar276 = auVar265._10_2_ >> 8;
  uVar277 = auVar268._12_2_ >> 8;
  uVar278 = auVar271._14_2_ >> 8;
  *dst = (0 < sVar76) * (sVar76 < 0x100) * auVar218[0] - (0xff < sVar76);
  dst[1] = (0 < sVar78) * (sVar78 < 0x100) * auVar218[2] - (0xff < sVar78);
  dst[2] = (0 < sVar81) * (sVar81 < 0x100) * auVar218[4] - (0xff < sVar81);
  dst[3] = (0 < sVar85) * (sVar85 < 0x100) * auVar218[6] - (0xff < sVar85);
  dst[4] = (0 < sVar88) * (sVar88 < 0x100) * auVar218[8] - (0xff < sVar88);
  dst[5] = (0 < sVar91) * (sVar91 < 0x100) * auVar218[10] - (0xff < sVar91);
  dst[6] = (0 < sVar94) * (sVar94 < 0x100) * auVar218[0xc] - (0xff < sVar94);
  dst[7] = (0 < sVar97) * (sVar97 < 0x100) * auVar218[0xe] - (0xff < sVar97);
  dst[8] = (0 < sVar100) * (sVar100 < 0x100) * auVar306[0] - (0xff < sVar100);
  dst[9] = (0 < sVar103) * (sVar103 < 0x100) * auVar306[2] - (0xff < sVar103);
  dst[10] = (0 < sVar106) * (sVar106 < 0x100) * auVar306[4] - (0xff < sVar106);
  dst[0xb] = (0 < sVar109) * (sVar109 < 0x100) * auVar306[6] - (0xff < sVar109);
  dst[0xc] = (0 < sVar112) * (sVar112 < 0x100) * auVar306[8] - (0xff < sVar112);
  dst[0xd] = (0 < sVar115) * (sVar115 < 0x100) * auVar306[10] - (0xff < sVar115);
  dst[0xe] = (0 < sVar118) * (sVar118 < 0x100) * auVar306[0xc] - (0xff < sVar118);
  dst[0xf] = (0 < sVar121) * (sVar121 < 0x100) * auVar306[0xe] - (0xff < sVar121);
  dst[0x10] = (0 < sVar77) * (sVar77 < 0x100) * auVar339[0] - (0xff < sVar77);
  dst[0x11] = (0 < sVar79) * (sVar79 < 0x100) * auVar339[2] - (0xff < sVar79);
  dst[0x12] = (0 < sVar82) * (sVar82 < 0x100) * auVar339[4] - (0xff < sVar82);
  dst[0x13] = (0 < sVar86) * (sVar86 < 0x100) * auVar339[6] - (0xff < sVar86);
  dst[0x14] = (0 < sVar89) * (sVar89 < 0x100) * auVar339[8] - (0xff < sVar89);
  dst[0x15] = (0 < sVar92) * (sVar92 < 0x100) * auVar339[10] - (0xff < sVar92);
  dst[0x16] = (0 < sVar95) * (sVar95 < 0x100) * auVar339[0xc] - (0xff < sVar95);
  dst[0x17] = (0 < sVar98) * (sVar98 < 0x100) * auVar339[0xe] - (0xff < sVar98);
  dst[0x18] = (0 < sVar101) * (sVar101 < 0x100) * auVar365[0] - (0xff < sVar101);
  dst[0x19] = (0 < sVar104) * (sVar104 < 0x100) * auVar365[2] - (0xff < sVar104);
  dst[0x1a] = (0 < sVar107) * (sVar107 < 0x100) * auVar365[4] - (0xff < sVar107);
  dst[0x1b] = (0 < sVar110) * (sVar110 < 0x100) * auVar365[6] - (0xff < sVar110);
  dst[0x1c] = (0 < sVar113) * (sVar113 < 0x100) * auVar365[8] - (0xff < sVar113);
  dst[0x1d] = (0 < sVar116) * (sVar116 < 0x100) * auVar365[10] - (0xff < sVar116);
  dst[0x1e] = (0 < sVar119) * (sVar119 < 0x100) * auVar365[0xc] - (0xff < sVar119);
  dst[0x1f] = (0 < sVar122) * (sVar122 < 0x100) * auVar365[0xe] - (0xff < sVar122);
  dst[0x20] = (0 < sVar84) * (sVar84 < 0x100) * auVar364[0] - (0xff < sVar84);
  dst[0x21] = (0 < sVar80) * (sVar80 < 0x100) * auVar364[2] - (0xff < sVar80);
  dst[0x22] = (0 < sVar83) * (sVar83 < 0x100) * auVar364[4] - (0xff < sVar83);
  dst[0x23] = (0 < sVar87) * (sVar87 < 0x100) * auVar364[6] - (0xff < sVar87);
  dst[0x24] = (0 < sVar90) * (sVar90 < 0x100) * auVar364[8] - (0xff < sVar90);
  dst[0x25] = (0 < sVar93) * (sVar93 < 0x100) * auVar364[10] - (0xff < sVar93);
  dst[0x26] = (0 < sVar96) * (sVar96 < 0x100) * auVar364[0xc] - (0xff < sVar96);
  dst[0x27] = (0 < sVar99) * (sVar99 < 0x100) * auVar364[0xe] - (0xff < sVar99);
  dst[0x28] = (0 < sVar102) * (sVar102 < 0x100) * auVar200[0] - (0xff < sVar102);
  dst[0x29] = (0 < sVar105) * (sVar105 < 0x100) * auVar200[2] - (0xff < sVar105);
  dst[0x2a] = (0 < sVar108) * (sVar108 < 0x100) * auVar200[4] - (0xff < sVar108);
  dst[0x2b] = (0 < sVar111) * (sVar111 < 0x100) * auVar200[6] - (0xff < sVar111);
  dst[0x2c] = (0 < sVar114) * (sVar114 < 0x100) * auVar200[8] - (0xff < sVar114);
  dst[0x2d] = (0 < sVar117) * (sVar117 < 0x100) * auVar200[10] - (0xff < sVar117);
  dst[0x2e] = (0 < sVar120) * (sVar120 < 0x100) * auVar200[0xc] - (0xff < sVar120);
  dst[0x2f] = (0 < sVar123) * (sVar123 < 0x100) * auVar200[0xe] - (0xff < sVar123);
  dst[0x30] = (uVar206 != 0) * (uVar206 < 0x100) * bVar33 - (0xff < uVar206);
  dst[0x31] = (uVar223 != 0) * (uVar223 < 0x100) * cVar45 - (0xff < uVar223);
  dst[0x32] = (uVar224 != 0) * (uVar224 < 0x100) * cVar40 - (0xff < uVar224);
  dst[0x33] = (uVar225 != 0) * (uVar225 < 0x100) * cVar39 - (0xff < uVar225);
  dst[0x34] = (uVar226 != 0) * (uVar226 < 0x100) * cVar5 - (0xff < uVar226);
  dst[0x35] = (uVar227 != 0) * (uVar227 < 0x100) * cVar20 - (0xff < uVar227);
  dst[0x36] = (uVar228 != 0) * (uVar228 < 0x100) * cVar14 - (0xff < uVar228);
  dst[0x37] = (uVar229 != 0) * (uVar229 < 0x100) * cVar15 - (0xff < uVar229);
  dst[0x38] = (uVar318 != 0) * (uVar318 < 0x100) * bVar41 - (0xff < uVar318);
  dst[0x39] = (uVar328 != 0) * (uVar328 < 0x100) * cVar48 - (0xff < uVar328);
  dst[0x3a] = (uVar329 != 0) * (uVar329 < 0x100) * cVar47 - (0xff < uVar329);
  dst[0x3b] = (uVar330 != 0) * (uVar330 < 0x100) * cVar46 - (0xff < uVar330);
  dst[0x3c] = (uVar331 != 0) * (uVar331 < 0x100) * cVar44 - (0xff < uVar331);
  dst[0x3d] = (uVar332 != 0) * (uVar332 < 0x100) * cVar43 - (0xff < uVar332);
  dst[0x3e] = (uVar333 != 0) * (uVar333 < 0x100) * cVar42 - (0xff < uVar333);
  dst[0x3f] = (uVar334 != 0) * (uVar334 < 0x100) * cVar50 - (0xff < uVar334);
  dst[0x40] = (uVar279 != 0) * (uVar279 < 0x100) * bVar49 - (0xff < uVar279);
  dst[0x41] = (uVar292 != 0) * (uVar292 < 0x100) * cVar56 - (0xff < uVar292);
  dst[0x42] = (uVar293 != 0) * (uVar293 < 0x100) * cVar51 - (0xff < uVar293);
  dst[0x43] = (uVar294 != 0) * (uVar294 < 0x100) * cVar55 - (0xff < uVar294);
  dst[0x44] = (uVar295 != 0) * (uVar295 < 0x100) * cVar63 - (0xff < uVar295);
  dst[0x45] = (uVar296 != 0) * (uVar296 < 0x100) * cVar54 - (0xff < uVar296);
  dst[0x46] = (uVar297 != 0) * (uVar297 < 0x100) * cVar53 - (0xff < uVar297);
  dst[0x47] = (uVar298 != 0) * (uVar298 < 0x100) * cVar52 - (0xff < uVar298);
  dst[0x48] = (uVar343 != 0) * (uVar343 < 0x100) * bVar57 - (0xff < uVar343);
  dst[0x49] = (uVar348 != 0) * (uVar348 < 0x100) * cVar4 - (0xff < uVar348);
  dst[0x4a] = (uVar349 != 0) * (uVar349 < 0x100) * cVar6 - (0xff < uVar349);
  dst[0x4b] = (uVar350 != 0) * (uVar350 < 0x100) * cVar2 - (0xff < uVar350);
  dst[0x4c] = (uVar351 != 0) * (uVar351 < 0x100) * cVar13 - (0xff < uVar351);
  dst[0x4d] = (uVar352 != 0) * (uVar352 < 0x100) * cVar11 - (0xff < uVar352);
  dst[0x4e] = (uVar353 != 0) * (uVar353 < 0x100) * cVar10 - (0xff < uVar353);
  dst[0x4f] = (uVar354 != 0) * (uVar354 < 0x100) * cVar19 - (0xff < uVar354);
  dst[0x50] = (uVar230 != 0) * (uVar230 < 0x100) * bVar9 - (0xff < uVar230);
  dst[0x51] = (uVar239 != 0) * (uVar239 < 0x100) * cVar60 - (0xff < uVar239);
  dst[0x52] = (uVar240 != 0) * (uVar240 < 0x100) * cVar62 - (0xff < uVar240);
  dst[0x53] = (uVar241 != 0) * (uVar241 < 0x100) * cVar21 - (0xff < uVar241);
  dst[0x54] = (uVar242 != 0) * (uVar242 < 0x100) * cVar64 - (0xff < uVar242);
  dst[0x55] = (uVar243 != 0) * (uVar243 < 0x100) * cVar26 - (0xff < uVar243);
  dst[0x56] = (uVar244 != 0) * (uVar244 < 0x100) * cVar23 - (0xff < uVar244);
  dst[0x57] = (uVar245 != 0) * (uVar245 < 0x100) * cVar7 - (0xff < uVar245);
  dst[0x58] = (uVar259 != 0) * (uVar259 < 0x100) * bVar17 - (0xff < uVar259);
  dst[0x59] = (uVar272 != 0) * (uVar272 < 0x100) * cVar24 - (0xff < uVar272);
  dst[0x5a] = (uVar273 != 0) * (uVar273 < 0x100) * cVar31 - (0xff < uVar273);
  dst[0x5b] = (uVar274 != 0) * (uVar274 < 0x100) * cVar32 - (0xff < uVar274);
  dst[0x5c] = (uVar275 != 0) * (uVar275 < 0x100) * cVar30 - (0xff < uVar275);
  dst[0x5d] = (uVar276 != 0) * (uVar276 < 0x100) * cVar18 - (0xff < uVar276);
  dst[0x5e] = (uVar277 != 0) * (uVar277 < 0x100) * cVar16 - (0xff < uVar277);
  dst[0x5f] = (uVar278 != 0) * (uVar278 < 0x100) * cVar3 - (0xff < uVar278);
  return;
}

Assistant:

void VP8YuvToBgr32_SSE2(const uint8_t* WEBP_RESTRICT y,
                        const uint8_t* WEBP_RESTRICT u,
                        const uint8_t* WEBP_RESTRICT v,
                        uint8_t* WEBP_RESTRICT dst) {
  __m128i R0, R1, R2, R3, G0, G1, G2, G3, B0, B1, B2, B3;
  __m128i bgr0, bgr1, bgr2, bgr3, bgr4, bgr5;

  YUV444ToRGB_SSE2(y +  0, u +  0, v +  0, &R0, &G0, &B0);
  YUV444ToRGB_SSE2(y +  8, u +  8, v +  8, &R1, &G1, &B1);
  YUV444ToRGB_SSE2(y + 16, u + 16, v + 16, &R2, &G2, &B2);
  YUV444ToRGB_SSE2(y + 24, u + 24, v + 24, &R3, &G3, &B3);

  // Cast to 8b and store as BBBBGGGGRRRR.
  bgr0 = _mm_packus_epi16(B0, B1);
  bgr1 = _mm_packus_epi16(B2, B3);
  bgr2 = _mm_packus_epi16(G0, G1);
  bgr3 = _mm_packus_epi16(G2, G3);
  bgr4 = _mm_packus_epi16(R0, R1);
  bgr5= _mm_packus_epi16(R2, R3);

  // Pack as BGRBGRBGRBGR.
  PlanarTo24b_SSE2(&bgr0, &bgr1, &bgr2, &bgr3, &bgr4, &bgr5, dst);
}